

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void run_static_context_tests(int use_prealloc)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *__s;
  secp256k1_context *psVar4;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  code *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *psVar5;
  secp256k1_context *extraout_RAX_07;
  code *pcVar6;
  long lVar7;
  int unaff_EBP;
  void *unaff_R14;
  uchar *p;
  secp256k1_context *unaff_R15;
  bool bVar8;
  int32_t _calls_to_illegal_callback;
  secp256k1_callback _saved_illegal_cb;
  uchar seed [32];
  int iStack_2ac;
  size_t sStack_2a8;
  undefined1 auStack_2a0 [8];
  secp256k1_pubkey *psStack_298;
  uchar auStack_290 [56];
  undefined8 uStack_258;
  byte abStack_250 [8];
  uchar auStack_248 [16];
  undefined8 uStack_238;
  byte abStack_220 [48];
  undefined1 auStack_1f0 [8];
  secp256k1_pubkey *psStack_1e8;
  uchar auStack_1e0 [40];
  uchar auStack_1b8 [8];
  undefined1 auStack_1b0 [16];
  undefined1 auStack_1a0 [16];
  undefined1 auStack_190 [16];
  undefined1 auStack_180 [16];
  byte abStack_170 [8];
  uchar auStack_168 [24];
  undefined1 auStack_150 [16];
  uchar auStack_140 [8];
  uchar auStack_138 [8];
  uchar auStack_130 [8];
  uchar auStack_128 [8];
  uchar auStack_120 [8];
  uchar auStack_118 [8];
  undefined8 uStack_110;
  secp256k1_pubkey *psStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  secp256k1_pubkey *psStack_e0;
  secp256k1_pubkey *psStack_d8;
  secp256k1_pubkey *psStack_d0;
  undefined1 auStack_c0 [16];
  uchar auStack_b0 [8];
  uchar auStack_a8 [8];
  uchar auStack_a0 [8];
  uchar auStack_98 [8];
  uchar auStack_90 [8];
  uchar auStack_88 [8];
  ulong *puStack_80;
  void *pvStack_78;
  secp256k1_context *psStack_70;
  undefined1 local_5c [20];
  ulong local_48 [4];
  
  psVar5 = STATIC_CTX;
  if (secp256k1_context_no_precomp == secp256k1_context_static) {
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[0] = 0x17;
    local_48[1] = 0;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (STATIC_CTX->illegal_callback).fn;
    local_5c._12_8_ = (STATIC_CTX->illegal_callback).data;
    if (secp256k1_context_static == STATIC_CTX) goto LAB_0013da89;
    (STATIC_CTX->illegal_callback).fn = counting_illegal_callback_fn;
    (psVar5->illegal_callback).data = local_5c;
  }
  else {
    psStack_70 = (secp256k1_context *)0x13da89;
    run_static_context_tests_cold_1();
    psVar5 = extraout_RAX_00;
    use_prealloc = unaff_EBP;
LAB_0013da89:
    psStack_70 = (secp256k1_context *)0x13da9d;
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  }
  psStack_70 = (secp256k1_context *)0x13d6ac;
  iVar2 = secp256k1_context_randomize(STATIC_CTX,(uchar *)local_48);
  psVar5 = STATIC_CTX;
  if (iVar2 == 0) {
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (psVar5->illegal_callback).data = (void *)local_5c._12_8_;
    if (local_5c._0_4_ != 1) goto LAB_0013daa7;
    local_5c._0_4_ = 0;
    local_5c._4_8_ = (psVar5->illegal_callback).fn;
    local_5c._12_8_ = (psVar5->illegal_callback).data;
    if (secp256k1_context_static != psVar5) {
      (psVar5->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar5->illegal_callback).data = local_5c;
      goto LAB_0013d710;
    }
  }
  else {
    psStack_70 = (secp256k1_context *)0x13daa7;
    run_static_context_tests_cold_2();
LAB_0013daa7:
    psStack_70 = (secp256k1_context *)0x13daac;
    run_static_context_tests_cold_3();
    psVar5 = extraout_RAX_01;
  }
  psStack_70 = (secp256k1_context *)0x13dac0;
  (*(psVar5->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
LAB_0013d710:
  psStack_70 = (secp256k1_context *)0x13d71e;
  iVar2 = secp256k1_context_randomize(STATIC_CTX,(uchar *)0x0);
  psVar5 = STATIC_CTX;
  if (iVar2 == 0) {
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (psVar5->illegal_callback).data = (void *)local_5c._12_8_;
    if (local_5c._0_4_ == 1) {
      pcVar6 = (code *)&psVar5->illegal_callback;
      if (use_prealloc == 0) goto LAB_0013d8f7;
      local_5c._0_4_ = 0;
      local_5c._4_8_ = ((secp256k1_callback *)pcVar6)->fn;
      local_5c._12_8_ = (psVar5->illegal_callback).data;
      if (secp256k1_context_static == psVar5) goto LAB_0013db0a;
      (psVar5->illegal_callback).fn = counting_illegal_callback_fn;
      pcVar6 = (code *)local_5c;
      (psVar5->illegal_callback).data = pcVar6;
      goto LAB_0013d78a;
    }
  }
  else {
    psStack_70 = (secp256k1_context *)0x13daca;
    run_static_context_tests_cold_4();
  }
  psStack_70 = (secp256k1_context *)0x13dacf;
  run_static_context_tests_cold_5();
  psVar5 = extraout_RAX_02;
LAB_0013dacf:
  psStack_70 = (secp256k1_context *)0x13dae3;
  (*(psVar5->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  do {
    psVar5 = STATIC_CTX;
    if ((STATIC_CTX->illegal_callback).fn == counting_illegal_callback_fn) {
      if ((ulong *)(STATIC_CTX->illegal_callback).data != local_48) goto LAB_0013daed;
      pcVar6 = counting_illegal_callback_fn;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0013daf2;
      (STATIC_CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
      (psVar5->illegal_callback).data = (void *)0x0;
    }
    else {
      psStack_70 = (secp256k1_context *)0x13daed;
      run_static_context_tests_cold_16();
LAB_0013daed:
      psStack_70 = (secp256k1_context *)0x13daf2;
      run_static_context_tests_cold_17();
      pcVar6 = extraout_RAX_03;
LAB_0013daf2:
      psStack_70 = (secp256k1_context *)0x13dafb;
      (*pcVar6)("ctx != secp256k1_context_static");
    }
    pcVar6 = secp256k1_default_illegal_callback_fn;
    if ((STATIC_CTX->illegal_callback).fn == secp256k1_default_illegal_callback_fn) {
      if ((STATIC_CTX->illegal_callback).data == (void *)0x0) {
        return;
      }
    }
    else {
      psStack_70 = (secp256k1_context *)0x13db05;
      run_static_context_tests_cold_18();
    }
    psStack_70 = (secp256k1_context *)0x13db0a;
    run_static_context_tests_cold_19();
    psVar5 = extraout_RAX_04;
LAB_0013db0a:
    psStack_70 = (secp256k1_context *)0x13db1e;
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
LAB_0013d78a:
    psStack_70 = (secp256k1_context *)0x13d796;
    sVar3 = secp256k1_context_preallocated_clone_size(STATIC_CTX);
    psVar5 = STATIC_CTX;
    if (sVar3 == 0) {
      (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
      (psVar5->illegal_callback).data = (void *)local_5c._12_8_;
      unaff_R15 = psVar5;
      if (local_5c._0_4_ != 1) goto LAB_0013db28;
      psStack_70 = (secp256k1_context *)0x13d7c8;
      __s = malloc(0xe8);
      if (__s == (void *)0x0) goto LAB_0013db2d;
      psStack_70 = (secp256k1_context *)0x13d7ed;
      memset(__s,0x2a,0xe8);
      local_5c._0_4_ = 0;
      local_5c._4_8_ = (psVar5->illegal_callback).fn;
      local_5c._12_8_ = (psVar5->illegal_callback).data;
      unaff_R14 = __s;
      if (secp256k1_context_static == psVar5) goto LAB_0013db32;
      (psVar5->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar5->illegal_callback).data = local_5c;
    }
    else {
      psStack_70 = (secp256k1_context *)0x13db28;
      run_static_context_tests_cold_6();
LAB_0013db28:
      psStack_70 = (secp256k1_context *)0x13db2d;
      run_static_context_tests_cold_7();
LAB_0013db2d:
      psStack_70 = (secp256k1_context *)0x13db32;
      run_static_context_tests_cold_12();
LAB_0013db32:
      psStack_70 = (secp256k1_context *)0x13db47;
      (*(unaff_R15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(unaff_R15->illegal_callback).data);
    }
    psStack_70 = (secp256k1_context *)0x13d835;
    psVar4 = secp256k1_context_preallocated_clone(STATIC_CTX,unaff_R14);
    psVar5 = STATIC_CTX;
    if (psVar4 == (secp256k1_context *)0x0) {
      (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
      (psVar5->illegal_callback).data = (void *)local_5c._12_8_;
      unaff_R15 = psVar5;
      if (local_5c._0_4_ != 1) goto LAB_0013db51;
      lVar7 = 0;
      do {
        cVar1 = *(char *)((long)unaff_R14 + lVar7);
        pcVar6 = (code *)CONCAT71((int7)((ulong)pcVar6 >> 8),cVar1);
        if (cVar1 != '*') break;
        bVar8 = lVar7 != 0xe7;
        lVar7 = lVar7 + 1;
      } while (bVar8);
      if (cVar1 != '*') goto LAB_0013db56;
      psStack_70 = (secp256k1_context *)0x13d88f;
      free(unaff_R14);
      local_5c._0_4_ = 0;
      local_5c._4_8_ = (psVar5->illegal_callback).fn;
      local_5c._12_8_ = (psVar5->illegal_callback).data;
      if (secp256k1_context_static == psVar5) goto LAB_0013db5b;
      (psVar5->illegal_callback).fn = counting_illegal_callback_fn;
      (psVar5->illegal_callback).data = local_5c;
    }
    else {
      psStack_70 = (secp256k1_context *)0x13db51;
      run_static_context_tests_cold_8();
LAB_0013db51:
      psStack_70 = (secp256k1_context *)0x13db56;
      run_static_context_tests_cold_9();
LAB_0013db56:
      psStack_70 = (secp256k1_context *)0x13db5b;
      run_static_context_tests_cold_11();
LAB_0013db5b:
      psStack_70 = (secp256k1_context *)0x13db70;
      (*(unaff_R15->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(unaff_R15->illegal_callback).data);
    }
    psStack_70 = (secp256k1_context *)0x13d8d4;
    secp256k1_context_preallocated_destroy(STATIC_CTX);
    psVar5 = STATIC_CTX;
    (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
    (psVar5->illegal_callback).data = (void *)local_5c._12_8_;
    if (local_5c._0_4_ != 1) {
      psStack_70 = (secp256k1_context *)0x13d8f7;
      run_static_context_tests_cold_10();
      psVar5 = extraout_RAX;
LAB_0013d8f7:
      local_5c._0_4_ = 0;
      local_5c._4_8_ = ((secp256k1_callback *)pcVar6)->fn;
      local_5c._12_8_ = ((secp256k1_callback *)pcVar6)->data;
      if (secp256k1_context_static == psVar5) {
        psStack_70 = (secp256k1_context *)0x13db89;
        (*(psVar5->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
      }
      else {
        (psVar5->illegal_callback).fn = counting_illegal_callback_fn;
        (psVar5->illegal_callback).data = local_5c;
      }
      psStack_70 = (secp256k1_context *)0x13d93a;
      psVar4 = secp256k1_context_clone(STATIC_CTX);
      psVar5 = STATIC_CTX;
      if (psVar4 == (secp256k1_context *)0x0) {
        (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
        (psVar5->illegal_callback).data = (void *)local_5c._12_8_;
        if (local_5c._0_4_ != 1) goto LAB_0013db93;
        local_5c._0_4_ = 0;
        local_5c._4_8_ = (psVar5->illegal_callback).fn;
        local_5c._12_8_ = (psVar5->illegal_callback).data;
        if (secp256k1_context_static == psVar5) goto LAB_0013db98;
        (psVar5->illegal_callback).fn = counting_illegal_callback_fn;
        (psVar5->illegal_callback).data = local_5c;
      }
      else {
        psStack_70 = (secp256k1_context *)0x13db93;
        run_static_context_tests_cold_13();
LAB_0013db93:
        psStack_70 = (secp256k1_context *)0x13db98;
        run_static_context_tests_cold_14();
        psVar5 = extraout_RAX_05;
LAB_0013db98:
        psStack_70 = (secp256k1_context *)0x13dbac;
        (*(psVar5->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
      }
      psStack_70 = (secp256k1_context *)0x13d9ab;
      secp256k1_context_destroy(STATIC_CTX);
      psVar5 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_5c._4_8_;
      (psVar5->illegal_callback).data = (void *)local_5c._12_8_;
      if (local_5c._0_4_ != 1) {
        psStack_70 = (secp256k1_context *)run_eckey_edge_case_test;
        run_static_context_tests_cold_15();
        auStack_168[8] = 0xba;
        auStack_168[9] = 0xae;
        auStack_168[10] = 0xdc;
        auStack_168[0xb] = 0xe6;
        auStack_168[0xc] = 0xaf;
        auStack_168[0xd] = 'H';
        auStack_168[0xe] = 0xa0;
        auStack_168[0xf] = ';';
        auStack_168[0x10] = 0xbf;
        auStack_168[0x11] = 0xd2;
        auStack_168[0x12] = '^';
        auStack_168[0x13] = 0x8c;
        auStack_168[0x14] = 0xd0;
        auStack_168[0x15] = '6';
        auStack_168[0x16] = 'A';
        auStack_168[0x17] = 'A';
        abStack_170[0] = 0xff;
        abStack_170[1] = 0xff;
        abStack_170[2] = 0xff;
        abStack_170[3] = 0xff;
        abStack_170[4] = 0xff;
        abStack_170[5] = 0xff;
        abStack_170[6] = 0xff;
        abStack_170[7] = 0xff;
        auStack_168[0] = 0xff;
        auStack_168[1] = 0xff;
        auStack_168[2] = 0xff;
        auStack_168[3] = 0xff;
        auStack_168[4] = 0xff;
        auStack_168[5] = 0xff;
        auStack_168[6] = 0xff;
        auStack_168[7] = 0xfe;
        auStack_180 = (undefined1  [16])0x0;
        auStack_190 = (undefined1  [16])0x0;
        auStack_1a0 = (undefined1  [16])0x0;
        auStack_1b0 = (undefined1  [16])0x0;
        puStack_80 = local_48;
        pvStack_78 = unaff_R14;
        psStack_70 = unaff_R15;
        iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_170);
        if (iVar2 == 0) {
          auStack_1f0[0] = '\x01';
          auStack_1f0[1] = '\0';
          auStack_1f0[2] = 'C';
          auStack_1f0[3] = 'M';
          auStack_1f0[4] = '\0';
          auStack_1f0[5] = '\0';
          auStack_1f0[6] = '\0';
          auStack_1f0[7] = '\0';
          auStack_1e0[0] = '@';
          auStack_1e0[1] = '\0';
          auStack_1e0[2] = '\0';
          auStack_1e0[3] = '\0';
          auStack_1e0[4] = '\0';
          auStack_1e0[5] = '\0';
          auStack_1e0[6] = '\0';
          auStack_1e0[7] = '\0';
          auStack_1e0[8] = '\0';
          auStack_1e0[9] = '\0';
          auStack_1e0[10] = '\0';
          auStack_1e0[0xb] = '\0';
          auStack_1e0[0xc] = '\0';
          auStack_1e0[0xd] = '\0';
          auStack_1e0[0xe] = '\0';
          auStack_1e0[0xf] = '\0';
          auStack_1e0[0x10] = '\0';
          auStack_1e0[0x11] = '\0';
          auStack_1e0[0x12] = '\0';
          auStack_1e0[0x13] = '\0';
          auStack_1e0[0x14] = '\0';
          auStack_1e0[0x15] = '\0';
          auStack_1e0[0x16] = '\0';
          auStack_1e0[0x17] = '\0';
          auStack_1e0[0x18] = '\0';
          auStack_1e0[0x19] = '\0';
          auStack_1e0[0x1a] = '\0';
          auStack_1e0[0x1b] = '\0';
          auStack_1e0[0x1c] = '\0';
          auStack_1e0[0x1d] = '\0';
          auStack_1e0[0x1e] = '\0';
          auStack_1e0[0x1f] = '\0';
          auStack_150[0] = '\0';
          auStack_150[1] = '\0';
          auStack_150[2] = '\0';
          auStack_150[3] = '\0';
          auStack_150[4] = '\0';
          auStack_150[5] = '\0';
          auStack_150[6] = '\0';
          auStack_150[7] = '\0';
          psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
          iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_170);
          if (iVar2 == 0) {
            auStack_1f0[0] = '\x05';
            auStack_1f0[1] = '\0';
            auStack_1f0[2] = 'C';
            auStack_1f0[3] = 'M';
            auStack_1f0[4] = '\0';
            auStack_1f0[5] = '\0';
            auStack_1f0[6] = '\0';
            auStack_1f0[7] = '\0';
            psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
            auStack_1e0[0] = '@';
            auStack_1e0[1] = '\0';
            auStack_1e0[2] = '\0';
            auStack_1e0[3] = '\0';
            auStack_1e0[4] = '\0';
            auStack_1e0[5] = '\0';
            auStack_1e0[6] = '\0';
            auStack_1e0[7] = '\0';
            lVar7 = 0;
            auStack_1e0[8] = '\0';
            auStack_1e0[9] = '\0';
            auStack_1e0[10] = '\0';
            auStack_1e0[0xb] = '\0';
            auStack_1e0[0xc] = '\0';
            auStack_1e0[0xd] = '\0';
            auStack_1e0[0xe] = '\0';
            auStack_1e0[0xf] = '\0';
            auStack_1e0[0x10] = '\0';
            auStack_1e0[0x11] = '\0';
            auStack_1e0[0x12] = '\0';
            auStack_1e0[0x13] = '\0';
            auStack_1e0[0x14] = '\0';
            auStack_1e0[0x15] = '\0';
            auStack_1e0[0x16] = '\0';
            auStack_1e0[0x17] = '\0';
            auStack_1e0[0x18] = '\0';
            auStack_1e0[0x19] = '\0';
            auStack_1e0[0x1a] = '\0';
            auStack_1e0[0x1b] = '\0';
            auStack_1e0[0x1c] = '\0';
            auStack_1e0[0x1d] = '\0';
            auStack_1e0[0x1e] = '\0';
            auStack_1e0[0x1f] = '\0';
            auStack_150[0] = '\0';
            auStack_150[1] = '\0';
            auStack_150[2] = '\0';
            auStack_150[3] = '\0';
            auStack_150[4] = '\0';
            auStack_150[5] = '\0';
            auStack_150[6] = '\0';
            auStack_150[7] = '\0';
            break;
          }
        }
        else {
          run_eckey_edge_case_test_cold_1();
        }
        run_eckey_edge_case_test_cold_2();
        goto LAB_0013f6dd;
      }
    }
    psVar5 = STATIC_CTX;
    local_48[0] = local_48[0] & 0xffffffff00000000;
    if (secp256k1_context_static == STATIC_CTX) goto LAB_0013dacf;
    (STATIC_CTX->illegal_callback).fn = counting_illegal_callback_fn;
    (psVar5->illegal_callback).data = local_48;
  } while( true );
  while (lVar7 = lVar7 + 1, lVar7 != 0x40) {
    iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
    if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013dd03;
  }
  iVar2 = 0;
LAB_0013dd03:
  if (iVar2 == 0) {
    auStack_248[8] = 0xff;
    auStack_248[9] = 0xff;
    auStack_248[10] = 0xff;
    auStack_248[0xb] = 0xff;
    auStack_248[0xc] = 0xff;
    auStack_248[0xd] = 0xff;
    auStack_248[0xe] = 0xff;
    auStack_248[0xf] = 0xff;
    uStack_238._0_1_ = 0xff;
    uStack_238._1_1_ = 0xff;
    uStack_238._2_1_ = 0xff;
    uStack_238._3_1_ = 0xff;
    uStack_238._4_1_ = 0xff;
    uStack_238._5_1_ = 0xff;
    uStack_238._6_1_ = 0xff;
    uStack_238._7_1_ = 0xff;
    abStack_250[0] = 0xff;
    abStack_250[1] = 0xff;
    abStack_250[2] = 0xff;
    abStack_250[3] = 0xff;
    abStack_250[4] = 0xff;
    abStack_250[5] = 0xff;
    abStack_250[6] = 0xff;
    abStack_250[7] = 0xff;
    auStack_248[0] = 0xff;
    auStack_248[1] = 0xff;
    auStack_248[2] = 0xff;
    auStack_248[3] = 0xff;
    auStack_248[4] = 0xff;
    auStack_248[5] = 0xff;
    auStack_248[6] = 0xff;
    auStack_248[7] = 0xff;
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_250);
    if (iVar2 != 0) goto LAB_0013f6e2;
    builtin_memcpy(auStack_290 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStack_2a0[0] = '\x01';
    auStack_2a0[1] = '\x01';
    auStack_2a0[2] = '\x01';
    auStack_2a0[3] = '\x01';
    auStack_2a0[4] = '\x01';
    auStack_2a0[5] = '\x01';
    auStack_2a0[6] = '\x01';
    auStack_2a0[7] = '\x01';
    psStack_298 = (secp256k1_pubkey *)0x101010101010101;
    auStack_1f0[0] = '\x01';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_250);
    if (iVar2 != 0) goto LAB_0013f6e7;
    auStack_1f0[0] = '\x05';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    lVar7 = 0;
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013de2a;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013de2a:
    if (iVar2 != 0) goto LAB_0013f6ec;
    auStack_248[8] = '\0';
    auStack_248[9] = '\0';
    auStack_248[10] = '\0';
    auStack_248[0xb] = '\0';
    auStack_248[0xc] = '\0';
    auStack_248[0xd] = '\0';
    auStack_248[0xe] = '\0';
    auStack_248[0xf] = '\0';
    uStack_238._0_1_ = '\0';
    uStack_238._1_1_ = '\0';
    uStack_238._2_1_ = '\0';
    uStack_238._3_1_ = '\0';
    uStack_238._4_1_ = '\0';
    uStack_238._5_1_ = '\0';
    uStack_238._6_1_ = '\0';
    uStack_238._7_1_ = '\0';
    abStack_250[0] = '\0';
    abStack_250[1] = '\0';
    abStack_250[2] = '\0';
    abStack_250[3] = '\0';
    abStack_250[4] = '\0';
    abStack_250[5] = '\0';
    abStack_250[6] = '\0';
    abStack_250[7] = '\0';
    auStack_248[0] = '\0';
    auStack_248[1] = '\0';
    auStack_248[2] = '\0';
    auStack_248[3] = '\0';
    auStack_248[4] = '\0';
    auStack_248[5] = '\0';
    auStack_248[6] = '\0';
    auStack_248[7] = '\0';
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_250);
    if (iVar2 != 0) goto LAB_0013f6f1;
    builtin_memcpy(auStack_290 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStack_2a0[0] = '\x01';
    auStack_2a0[1] = '\x01';
    auStack_2a0[2] = '\x01';
    auStack_2a0[3] = '\x01';
    auStack_2a0[4] = '\x01';
    auStack_2a0[5] = '\x01';
    auStack_2a0[6] = '\x01';
    auStack_2a0[7] = '\x01';
    psStack_298 = (secp256k1_pubkey *)0x101010101010101;
    auStack_1f0[0] = '\x01';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_250);
    if (iVar2 != 0) goto LAB_0013f6f6;
    auStack_1f0[0] = '\x05';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    lVar7 = 0;
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013df4e;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013df4e:
    if (iVar2 != 0) goto LAB_0013f6fb;
    uStack_238._7_1_ = '\x01';
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_250);
    if (iVar2 == 0) goto LAB_0013f700;
    auStack_290[0x20] = '\0';
    auStack_290[0x21] = '\0';
    auStack_290[0x22] = '\0';
    auStack_290[0x23] = '\0';
    auStack_290[0x24] = '\0';
    auStack_290[0x25] = '\0';
    auStack_290[0x26] = '\0';
    auStack_290[0x27] = '\0';
    auStack_290[0x28] = '\0';
    auStack_290[0x29] = '\0';
    auStack_290[0x2a] = '\0';
    auStack_290[0x2b] = '\0';
    auStack_290[0x2c] = '\0';
    auStack_290[0x2d] = '\0';
    auStack_290[0x2e] = '\0';
    auStack_290[0x2f] = '\0';
    auStack_290[0x10] = '\0';
    auStack_290[0x11] = '\0';
    auStack_290[0x12] = '\0';
    auStack_290[0x13] = '\0';
    auStack_290[0x14] = '\0';
    auStack_290[0x15] = '\0';
    auStack_290[0x16] = '\0';
    auStack_290[0x17] = '\0';
    auStack_290[0x18] = '\0';
    auStack_290[0x19] = '\0';
    auStack_290[0x1a] = '\0';
    auStack_290[0x1b] = '\0';
    auStack_290[0x1c] = '\0';
    auStack_290[0x1d] = '\0';
    auStack_290[0x1e] = '\0';
    auStack_290[0x1f] = '\0';
    auStack_290[0] = '\0';
    auStack_290[1] = '\0';
    auStack_290[2] = '\0';
    auStack_290[3] = '\0';
    auStack_290[4] = '\0';
    auStack_290[5] = '\0';
    auStack_290[6] = '\0';
    auStack_290[7] = '\0';
    auStack_290[8] = '\0';
    auStack_290[9] = '\0';
    auStack_290[10] = '\0';
    auStack_290[0xb] = '\0';
    auStack_290[0xc] = '\0';
    auStack_290[0xd] = '\0';
    auStack_290[0xe] = '\0';
    auStack_290[0xf] = '\0';
    auStack_2a0[0] = '\0';
    auStack_2a0[1] = '\0';
    auStack_2a0[2] = '\0';
    auStack_2a0[3] = '\0';
    auStack_2a0[4] = '\0';
    auStack_2a0[5] = '\0';
    auStack_2a0[6] = '\0';
    auStack_2a0[7] = '\0';
    psStack_298 = (secp256k1_pubkey *)0x0;
    auStack_1f0[0] = '\x01';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_250);
    if (iVar2 == 0) goto LAB_0013f705;
    auStack_1f0[0] = '\x05';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    lVar7 = 0;
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e068;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e068:
    if (iVar2 < 1) goto LAB_0013f70a;
    auStack_120[0] = auStack_290[0x20];
    auStack_120[1] = auStack_290[0x21];
    auStack_120[2] = auStack_290[0x22];
    auStack_120[3] = auStack_290[0x23];
    auStack_120[4] = auStack_290[0x24];
    auStack_120[5] = auStack_290[0x25];
    auStack_120[6] = auStack_290[0x26];
    auStack_120[7] = auStack_290[0x27];
    auStack_118[0] = auStack_290[0x28];
    auStack_118[1] = auStack_290[0x29];
    auStack_118[2] = auStack_290[0x2a];
    auStack_118[3] = auStack_290[0x2b];
    auStack_118[4] = auStack_290[0x2c];
    auStack_118[5] = auStack_290[0x2d];
    auStack_118[6] = auStack_290[0x2e];
    auStack_118[7] = auStack_290[0x2f];
    auStack_130[0] = auStack_290[0x10];
    auStack_130[1] = auStack_290[0x11];
    auStack_130[2] = auStack_290[0x12];
    auStack_130[3] = auStack_290[0x13];
    auStack_130[4] = auStack_290[0x14];
    auStack_130[5] = auStack_290[0x15];
    auStack_130[6] = auStack_290[0x16];
    auStack_130[7] = auStack_290[0x17];
    auStack_128[0] = auStack_290[0x18];
    auStack_128[1] = auStack_290[0x19];
    auStack_128[2] = auStack_290[0x1a];
    auStack_128[3] = auStack_290[0x1b];
    auStack_128[4] = auStack_290[0x1c];
    auStack_128[5] = auStack_290[0x1d];
    auStack_128[6] = auStack_290[0x1e];
    auStack_128[7] = auStack_290[0x1f];
    auStack_140[0] = auStack_290[0];
    auStack_140[1] = auStack_290[1];
    auStack_140[2] = auStack_290[2];
    auStack_140[3] = auStack_290[3];
    auStack_140[4] = auStack_290[4];
    auStack_140[5] = auStack_290[5];
    auStack_140[6] = auStack_290[6];
    auStack_140[7] = auStack_290[7];
    auStack_138[0] = auStack_290[8];
    auStack_138[1] = auStack_290[9];
    auStack_138[2] = auStack_290[10];
    auStack_138[3] = auStack_290[0xb];
    auStack_138[4] = auStack_290[0xc];
    auStack_138[5] = auStack_290[0xd];
    auStack_138[6] = auStack_290[0xe];
    auStack_138[7] = auStack_290[0xf];
    auStack_150._0_8_ = auStack_2a0;
    auStack_150._8_8_ = psStack_298;
    auStack_248[8] = auStack_168[8];
    auStack_248[9] = auStack_168[9];
    auStack_248[10] = auStack_168[10];
    auStack_248[0xb] = auStack_168[0xb];
    auStack_248[0xc] = auStack_168[0xc];
    auStack_248[0xd] = auStack_168[0xd];
    auStack_248[0xe] = auStack_168[0xe];
    auStack_248[0xf] = auStack_168[0xf];
    abStack_250[0] = abStack_170[0];
    abStack_250[1] = abStack_170[1];
    abStack_250[2] = abStack_170[2];
    abStack_250[3] = abStack_170[3];
    abStack_250[4] = abStack_170[4];
    abStack_250[5] = abStack_170[5];
    abStack_250[6] = abStack_170[6];
    abStack_250[7] = abStack_170[7];
    auStack_248[0] = auStack_168[0];
    auStack_248[1] = auStack_168[1];
    auStack_248[2] = auStack_168[2];
    auStack_248[3] = auStack_168[3];
    auStack_248[4] = auStack_168[4];
    auStack_248[5] = auStack_168[5];
    auStack_248[6] = auStack_168[6];
    auStack_248[7] = auStack_168[7];
    uStack_238._0_7_ = (undefined7)auStack_168._16_8_;
    uStack_238._7_1_ = 'B';
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_250);
    if (iVar2 != 0) goto LAB_0013f70f;
    builtin_memcpy(auStack_290 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStack_2a0[0] = '\x01';
    auStack_2a0[1] = '\x01';
    auStack_2a0[2] = '\x01';
    auStack_2a0[3] = '\x01';
    auStack_2a0[4] = '\x01';
    auStack_2a0[5] = '\x01';
    auStack_2a0[6] = '\x01';
    auStack_2a0[7] = '\x01';
    psStack_298 = (secp256k1_pubkey *)0x101010101010101;
    auStack_1f0[0] = '\x01';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_c0[0] = '\0';
    auStack_c0[1] = '\0';
    auStack_c0[2] = '\0';
    auStack_c0[3] = '\0';
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_250);
    if (iVar2 != 0) goto LAB_0013f714;
    auStack_1f0[0] = '\x05';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    lVar7 = 0;
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_c0[0] = '\0';
    auStack_c0[1] = '\0';
    auStack_c0[2] = '\0';
    auStack_c0[3] = '\0';
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e1d1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e1d1:
    if (iVar2 != 0) goto LAB_0013f719;
    uStack_238._7_1_ = '@';
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_250);
    if (iVar2 == 0) goto LAB_0013f71e;
    auStack_290[0x20] = '\0';
    auStack_290[0x21] = '\0';
    auStack_290[0x22] = '\0';
    auStack_290[0x23] = '\0';
    auStack_290[0x24] = '\0';
    auStack_290[0x25] = '\0';
    auStack_290[0x26] = '\0';
    auStack_290[0x27] = '\0';
    auStack_290[0x28] = '\0';
    auStack_290[0x29] = '\0';
    auStack_290[0x2a] = '\0';
    auStack_290[0x2b] = '\0';
    auStack_290[0x2c] = '\0';
    auStack_290[0x2d] = '\0';
    auStack_290[0x2e] = '\0';
    auStack_290[0x2f] = '\0';
    auStack_290[0x10] = '\0';
    auStack_290[0x11] = '\0';
    auStack_290[0x12] = '\0';
    auStack_290[0x13] = '\0';
    auStack_290[0x14] = '\0';
    auStack_290[0x15] = '\0';
    auStack_290[0x16] = '\0';
    auStack_290[0x17] = '\0';
    auStack_290[0x18] = '\0';
    auStack_290[0x19] = '\0';
    auStack_290[0x1a] = '\0';
    auStack_290[0x1b] = '\0';
    auStack_290[0x1c] = '\0';
    auStack_290[0x1d] = '\0';
    auStack_290[0x1e] = '\0';
    auStack_290[0x1f] = '\0';
    auStack_290[0] = '\0';
    auStack_290[1] = '\0';
    auStack_290[2] = '\0';
    auStack_290[3] = '\0';
    auStack_290[4] = '\0';
    auStack_290[5] = '\0';
    auStack_290[6] = '\0';
    auStack_290[7] = '\0';
    auStack_290[8] = '\0';
    auStack_290[9] = '\0';
    auStack_290[10] = '\0';
    auStack_290[0xb] = '\0';
    auStack_290[0xc] = '\0';
    auStack_290[0xd] = '\0';
    auStack_290[0xe] = '\0';
    auStack_290[0xf] = '\0';
    auStack_2a0[0] = '\0';
    auStack_2a0[1] = '\0';
    auStack_2a0[2] = '\0';
    auStack_2a0[3] = '\0';
    auStack_2a0[4] = '\0';
    auStack_2a0[5] = '\0';
    auStack_2a0[6] = '\0';
    auStack_2a0[7] = '\0';
    psStack_298 = (secp256k1_pubkey *)0x0;
    auStack_1f0[0] = '\x01';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_c0[0] = '\0';
    auStack_c0[1] = '\0';
    auStack_c0[2] = '\0';
    auStack_c0[3] = '\0';
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_250);
    if (iVar2 == 0) goto LAB_0013f723;
    auStack_1f0[0] = '\x05';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = 'C';
    auStack_1f0[3] = 'M';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)auStack_2a0;
    auStack_1e0[0] = '@';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    lVar7 = 0;
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    auStack_1e0[0x10] = '\0';
    auStack_1e0[0x11] = '\0';
    auStack_1e0[0x12] = '\0';
    auStack_1e0[0x13] = '\0';
    auStack_1e0[0x14] = '\0';
    auStack_1e0[0x15] = '\0';
    auStack_1e0[0x16] = '\0';
    auStack_1e0[0x17] = '\0';
    auStack_1e0[0x18] = '\0';
    auStack_1e0[0x19] = '\0';
    auStack_1e0[0x1a] = '\0';
    auStack_1e0[0x1b] = '\0';
    auStack_1e0[0x1c] = '\0';
    auStack_1e0[0x1d] = '\0';
    auStack_1e0[0x1e] = '\0';
    auStack_1e0[0x1f] = '\0';
    auStack_c0[0] = '\0';
    auStack_c0[1] = '\0';
    auStack_c0[2] = '\0';
    auStack_c0[3] = '\0';
    auStack_c0[4] = '\0';
    auStack_c0[5] = '\0';
    auStack_c0[6] = '\0';
    auStack_c0[7] = '\0';
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e2eb;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e2eb:
    if (iVar2 < 1) goto LAB_0013f728;
    auStack_90[0] = auStack_290[0x20];
    auStack_90[1] = auStack_290[0x21];
    auStack_90[2] = auStack_290[0x22];
    auStack_90[3] = auStack_290[0x23];
    auStack_90[4] = auStack_290[0x24];
    auStack_90[5] = auStack_290[0x25];
    auStack_90[6] = auStack_290[0x26];
    auStack_90[7] = auStack_290[0x27];
    auStack_88[0] = auStack_290[0x28];
    auStack_88[1] = auStack_290[0x29];
    auStack_88[2] = auStack_290[0x2a];
    auStack_88[3] = auStack_290[0x2b];
    auStack_88[4] = auStack_290[0x2c];
    auStack_88[5] = auStack_290[0x2d];
    auStack_88[6] = auStack_290[0x2e];
    auStack_88[7] = auStack_290[0x2f];
    auStack_a0[0] = auStack_290[0x10];
    auStack_a0[1] = auStack_290[0x11];
    auStack_a0[2] = auStack_290[0x12];
    auStack_a0[3] = auStack_290[0x13];
    auStack_a0[4] = auStack_290[0x14];
    auStack_a0[5] = auStack_290[0x15];
    auStack_a0[6] = auStack_290[0x16];
    auStack_a0[7] = auStack_290[0x17];
    auStack_98[0] = auStack_290[0x18];
    auStack_98[1] = auStack_290[0x19];
    auStack_98[2] = auStack_290[0x1a];
    auStack_98[3] = auStack_290[0x1b];
    auStack_98[4] = auStack_290[0x1c];
    auStack_98[5] = auStack_290[0x1d];
    auStack_98[6] = auStack_290[0x1e];
    auStack_98[7] = auStack_290[0x1f];
    auStack_b0[0] = auStack_290[0];
    auStack_b0[1] = auStack_290[1];
    auStack_b0[2] = auStack_290[2];
    auStack_b0[3] = auStack_290[3];
    auStack_b0[4] = auStack_290[4];
    auStack_b0[5] = auStack_290[5];
    auStack_b0[6] = auStack_290[6];
    auStack_b0[7] = auStack_290[7];
    auStack_a8[0] = auStack_290[8];
    auStack_a8[1] = auStack_290[9];
    auStack_a8[2] = auStack_290[10];
    auStack_a8[3] = auStack_290[0xb];
    auStack_a8[4] = auStack_290[0xc];
    auStack_a8[5] = auStack_290[0xd];
    auStack_a8[6] = auStack_290[0xe];
    auStack_a8[7] = auStack_290[0xf];
    auStack_c0._0_8_ = auStack_2a0;
    auStack_c0._8_8_ = psStack_298;
    abStack_220[0] = 0;
    abStack_220[1] = 0;
    abStack_220[2] = 0;
    abStack_220[3] = 0;
    abStack_220[4] = 0;
    abStack_220[5] = 0;
    abStack_220[6] = 0;
    abStack_220[7] = 0;
    abStack_220[8] = 0;
    abStack_220[9] = 0;
    abStack_220[10] = 0;
    abStack_220[0xb] = 0;
    abStack_220[0xc] = 0;
    abStack_220[0xd] = 0;
    abStack_220[0xe] = 0;
    abStack_220[0xf] = 0;
    abStack_220[0x10] = 0;
    abStack_220[0x11] = 0;
    abStack_220[0x12] = 0;
    abStack_220[0x13] = 0;
    abStack_220[0x14] = 0;
    abStack_220[0x15] = 0;
    abStack_220[0x16] = 0;
    abStack_220[0x17] = 0;
    abStack_220[0x18] = 0;
    abStack_220[0x19] = 0;
    abStack_220[0x1a] = 0;
    abStack_220[0x1b] = 0;
    abStack_220[0x1c] = 0;
    abStack_220[0x1d] = 0;
    abStack_220[0x1e] = 0;
    abStack_220[0x1f] = 0;
    iVar2 = secp256k1_ec_seckey_tweak_add(CTX,abStack_250,abStack_220);
    if (iVar2 == 0) goto LAB_0013f72d;
    lVar7 = 0;
    do {
      iVar2 = (uint)abStack_170[lVar7] - (uint)abStack_250[lVar7];
      if (abStack_170[lVar7] != abStack_250[lVar7]) goto LAB_0013e37a;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x1f);
    iVar2 = 0;
LAB_0013e37a:
    if ((iVar2 != 0) || (uStack_238._7_1_ != '@')) goto LAB_0013f732;
    auStack_1e0[0x20] = auStack_290[0x20];
    auStack_1e0[0x21] = auStack_290[0x21];
    auStack_1e0[0x22] = auStack_290[0x22];
    auStack_1e0[0x23] = auStack_290[0x23];
    auStack_1e0[0x24] = auStack_290[0x24];
    auStack_1e0[0x25] = auStack_290[0x25];
    auStack_1e0[0x26] = auStack_290[0x26];
    auStack_1e0[0x27] = auStack_290[0x27];
    auStack_1b8[0] = auStack_290[0x28];
    auStack_1b8[1] = auStack_290[0x29];
    auStack_1b8[2] = auStack_290[0x2a];
    auStack_1b8[3] = auStack_290[0x2b];
    auStack_1b8[4] = auStack_290[0x2c];
    auStack_1b8[5] = auStack_290[0x2d];
    auStack_1b8[6] = auStack_290[0x2e];
    auStack_1b8[7] = auStack_290[0x2f];
    auStack_1e0[0x10] = auStack_290[0x10];
    auStack_1e0[0x11] = auStack_290[0x11];
    auStack_1e0[0x12] = auStack_290[0x12];
    auStack_1e0[0x13] = auStack_290[0x13];
    auStack_1e0[0x14] = auStack_290[0x14];
    auStack_1e0[0x15] = auStack_290[0x15];
    auStack_1e0[0x16] = auStack_290[0x16];
    auStack_1e0[0x17] = auStack_290[0x17];
    auStack_1e0[0x18] = auStack_290[0x18];
    auStack_1e0[0x19] = auStack_290[0x19];
    auStack_1e0[0x1a] = auStack_290[0x1a];
    auStack_1e0[0x1b] = auStack_290[0x1b];
    auStack_1e0[0x1c] = auStack_290[0x1c];
    auStack_1e0[0x1d] = auStack_290[0x1d];
    auStack_1e0[0x1e] = auStack_290[0x1e];
    auStack_1e0[0x1f] = auStack_290[0x1f];
    auStack_1e0[0] = auStack_290[0];
    auStack_1e0[1] = auStack_290[1];
    auStack_1e0[2] = auStack_290[2];
    auStack_1e0[3] = auStack_290[3];
    auStack_1e0[4] = auStack_290[4];
    auStack_1e0[5] = auStack_290[5];
    auStack_1e0[6] = auStack_290[6];
    auStack_1e0[7] = auStack_290[7];
    auStack_1e0[8] = auStack_290[8];
    auStack_1e0[9] = auStack_290[9];
    auStack_1e0[10] = auStack_290[10];
    auStack_1e0[0xb] = auStack_290[0xb];
    auStack_1e0[0xc] = auStack_290[0xc];
    auStack_1e0[0xd] = auStack_290[0xd];
    auStack_1e0[0xe] = auStack_290[0xe];
    auStack_1e0[0xf] = auStack_290[0xf];
    auStack_1f0 = auStack_2a0;
    psStack_1e8 = psStack_298;
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_220);
    if (iVar2 == 0) goto LAB_0013f737;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1f0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1f0[lVar7]) goto LAB_0013e405;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e405:
    if (iVar2 != 0) goto LAB_0013f73c;
    iVar2 = secp256k1_ec_seckey_tweak_mul(CTX,abStack_250,abStack_220);
    if (iVar2 != 0) goto LAB_0013f741;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_1b0[lVar7] - (uint)abStack_250[lVar7];
      if (auStack_1b0[lVar7] != abStack_250[lVar7]) goto LAB_0013e456;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar2 = 0;
LAB_0013e456:
    if (iVar2 != 0) goto LAB_0013f746;
    iVar2 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f74b;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e4a7;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e4a7:
    if (iVar2 != 0) goto LAB_0013f750;
    auStack_290[0x20] = auStack_1e0[0x20];
    auStack_290[0x21] = auStack_1e0[0x21];
    auStack_290[0x22] = auStack_1e0[0x22];
    auStack_290[0x23] = auStack_1e0[0x23];
    auStack_290[0x24] = auStack_1e0[0x24];
    auStack_290[0x25] = auStack_1e0[0x25];
    auStack_290[0x26] = auStack_1e0[0x26];
    auStack_290[0x27] = auStack_1e0[0x27];
    auStack_290[0x28] = auStack_1b8[0];
    auStack_290[0x29] = auStack_1b8[1];
    auStack_290[0x2a] = auStack_1b8[2];
    auStack_290[0x2b] = auStack_1b8[3];
    auStack_290[0x2c] = auStack_1b8[4];
    auStack_290[0x2d] = auStack_1b8[5];
    auStack_290[0x2e] = auStack_1b8[6];
    auStack_290[0x2f] = auStack_1b8[7];
    auStack_290[0x10] = auStack_1e0[0x10];
    auStack_290[0x11] = auStack_1e0[0x11];
    auStack_290[0x12] = auStack_1e0[0x12];
    auStack_290[0x13] = auStack_1e0[0x13];
    auStack_290[0x14] = auStack_1e0[0x14];
    auStack_290[0x15] = auStack_1e0[0x15];
    auStack_290[0x16] = auStack_1e0[0x16];
    auStack_290[0x17] = auStack_1e0[0x17];
    auStack_290[0x18] = auStack_1e0[0x18];
    auStack_290[0x19] = auStack_1e0[0x19];
    auStack_290[0x1a] = auStack_1e0[0x1a];
    auStack_290[0x1b] = auStack_1e0[0x1b];
    auStack_290[0x1c] = auStack_1e0[0x1c];
    auStack_290[0x1d] = auStack_1e0[0x1d];
    auStack_290[0x1e] = auStack_1e0[0x1e];
    auStack_290[0x1f] = auStack_1e0[0x1f];
    auStack_290[0] = auStack_1e0[0];
    auStack_290[1] = auStack_1e0[1];
    auStack_290[2] = auStack_1e0[2];
    auStack_290[3] = auStack_1e0[3];
    auStack_290[4] = auStack_1e0[4];
    auStack_290[5] = auStack_1e0[5];
    auStack_290[6] = auStack_1e0[6];
    auStack_290[7] = auStack_1e0[7];
    auStack_290[8] = auStack_1e0[8];
    auStack_290[9] = auStack_1e0[9];
    auStack_290[10] = auStack_1e0[10];
    auStack_290[0xb] = auStack_1e0[0xb];
    auStack_290[0xc] = auStack_1e0[0xc];
    auStack_290[0xd] = auStack_1e0[0xd];
    auStack_290[0xe] = auStack_1e0[0xe];
    auStack_290[0xf] = auStack_1e0[0xf];
    auStack_2a0 = auStack_1f0;
    psStack_298 = psStack_1e8;
    abStack_250[0] = abStack_170[0];
    abStack_250[1] = abStack_170[1];
    abStack_250[2] = abStack_170[2];
    abStack_250[3] = abStack_170[3];
    abStack_250[4] = abStack_170[4];
    abStack_250[5] = abStack_170[5];
    abStack_250[6] = abStack_170[6];
    abStack_250[7] = abStack_170[7];
    auStack_248[0] = auStack_168[0];
    auStack_248[1] = auStack_168[1];
    auStack_248[2] = auStack_168[2];
    auStack_248[3] = auStack_168[3];
    auStack_248[4] = auStack_168[4];
    auStack_248[5] = auStack_168[5];
    auStack_248[6] = auStack_168[6];
    auStack_248[7] = auStack_168[7];
    auStack_248[8] = auStack_168[8];
    auStack_248[9] = auStack_168[9];
    auStack_248[10] = auStack_168[10];
    auStack_248[0xb] = auStack_168[0xb];
    auStack_248[0xc] = auStack_168[0xc];
    auStack_248[0xd] = auStack_168[0xd];
    auStack_248[0xe] = auStack_168[0xe];
    auStack_248[0xf] = auStack_168[0xf];
    uStack_238._0_1_ = auStack_168[0x10];
    uStack_238._1_1_ = auStack_168[0x11];
    uStack_238._2_1_ = auStack_168[0x12];
    uStack_238._3_1_ = auStack_168[0x13];
    uStack_238._4_1_ = auStack_168[0x14];
    uStack_238._5_1_ = auStack_168[0x15];
    uStack_238._6_1_ = auStack_168[0x16];
    uStack_238._7_1_ = auStack_168[0x17];
    abStack_220[0x10] = 0;
    abStack_220[0x11] = 0;
    abStack_220[0x12] = 0;
    abStack_220[0x13] = 0;
    abStack_220[0x14] = 0;
    abStack_220[0x15] = 0;
    abStack_220[0x16] = 0;
    abStack_220[0x17] = 0;
    abStack_220[0] = 0;
    abStack_220[1] = 0;
    abStack_220[2] = 0;
    abStack_220[3] = 0;
    abStack_220[4] = 0;
    abStack_220[5] = 0;
    abStack_220[6] = 0;
    abStack_220[7] = 0;
    abStack_220[8] = 0;
    abStack_220[9] = 0;
    abStack_220[10] = 0;
    abStack_220[0xb] = 0;
    abStack_220[0xc] = 0;
    abStack_220[0xd] = 0;
    abStack_220[0xe] = 0;
    abStack_220[0xf] = 0;
    abStack_220[0x18] = 0;
    abStack_220[0x19] = 0;
    abStack_220[0x1a] = 0;
    abStack_220[0x1b] = 0;
    abStack_220[0x1c] = 0;
    abStack_220[0x1d] = 0;
    abStack_220[0x1e] = 0;
    abStack_220[0x1f] = 1;
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_220);
    if (iVar2 == 0) goto LAB_0013f755;
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_250);
    if (iVar2 != 0) goto LAB_0013f75a;
    iVar2 = secp256k1_ec_seckey_tweak_add(CTX,abStack_250,abStack_220);
    if (iVar2 != 0) goto LAB_0013f75f;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_1b0[lVar7] - (uint)abStack_250[lVar7];
      if (auStack_1b0[lVar7] != abStack_250[lVar7]) goto LAB_0013e589;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar2 = 0;
LAB_0013e589:
    if (iVar2 != 0) goto LAB_0013f764;
    auStack_248[8] = auStack_168[8];
    auStack_248[9] = auStack_168[9];
    auStack_248[10] = auStack_168[10];
    auStack_248[0xb] = auStack_168[0xb];
    auStack_248[0xc] = auStack_168[0xc];
    auStack_248[0xd] = auStack_168[0xd];
    auStack_248[0xe] = auStack_168[0xe];
    auStack_248[0xf] = auStack_168[0xf];
    uStack_238._0_1_ = auStack_168[0x10];
    uStack_238._1_1_ = auStack_168[0x11];
    uStack_238._2_1_ = auStack_168[0x12];
    uStack_238._3_1_ = auStack_168[0x13];
    uStack_238._4_1_ = auStack_168[0x14];
    uStack_238._5_1_ = auStack_168[0x15];
    uStack_238._6_1_ = auStack_168[0x16];
    uStack_238._7_1_ = auStack_168[0x17];
    abStack_250[0] = abStack_170[0];
    abStack_250[1] = abStack_170[1];
    abStack_250[2] = abStack_170[2];
    abStack_250[3] = abStack_170[3];
    abStack_250[4] = abStack_170[4];
    abStack_250[5] = abStack_170[5];
    abStack_250[6] = abStack_170[6];
    abStack_250[7] = abStack_170[7];
    auStack_248[0] = auStack_168[0];
    auStack_248[1] = auStack_168[1];
    auStack_248[2] = auStack_168[2];
    auStack_248[3] = auStack_168[3];
    auStack_248[4] = auStack_168[4];
    auStack_248[5] = auStack_168[5];
    auStack_248[6] = auStack_168[6];
    auStack_248[7] = auStack_168[7];
    iVar2 = secp256k1_ec_seckey_tweak_mul(CTX,abStack_250,abStack_220);
    if (iVar2 != 0) goto LAB_0013f769;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_1b0[lVar7] - (uint)abStack_250[lVar7];
      if (auStack_1b0[lVar7] != abStack_250[lVar7]) goto LAB_0013e5f1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar2 = 0;
LAB_0013e5f1:
    if (iVar2 != 0) goto LAB_0013f76e;
    auStack_248[8] = auStack_168[8];
    auStack_248[9] = auStack_168[9];
    auStack_248[10] = auStack_168[10];
    auStack_248[0xb] = auStack_168[0xb];
    auStack_248[0xc] = auStack_168[0xc];
    auStack_248[0xd] = auStack_168[0xd];
    auStack_248[0xe] = auStack_168[0xe];
    auStack_248[0xf] = auStack_168[0xf];
    abStack_250[0] = abStack_170[0];
    abStack_250[1] = abStack_170[1];
    abStack_250[2] = abStack_170[2];
    abStack_250[3] = abStack_170[3];
    abStack_250[4] = abStack_170[4];
    abStack_250[5] = abStack_170[5];
    abStack_250[6] = abStack_170[6];
    abStack_250[7] = abStack_170[7];
    auStack_248[0] = auStack_168[0];
    auStack_248[1] = auStack_168[1];
    auStack_248[2] = auStack_168[2];
    auStack_248[3] = auStack_168[3];
    auStack_248[4] = auStack_168[4];
    auStack_248[5] = auStack_168[5];
    auStack_248[6] = auStack_168[6];
    auStack_248[7] = auStack_168[7];
    uStack_238._0_7_ = (undefined7)auStack_168._16_8_;
    uStack_238._7_1_ = '@';
    iVar2 = secp256k1_ec_seckey_tweak_add(CTX,abStack_250,abStack_170);
    if (iVar2 != 0) goto LAB_0013f773;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_1b0[lVar7] - (uint)abStack_250[lVar7];
      if (auStack_1b0[lVar7] != abStack_250[lVar7]) goto LAB_0013e654;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar2 = 0;
LAB_0013e654:
    if (iVar2 != 0) goto LAB_0013f778;
    auStack_248[8] = auStack_168[8];
    auStack_248[9] = auStack_168[9];
    auStack_248[10] = auStack_168[10];
    auStack_248[0xb] = auStack_168[0xb];
    auStack_248[0xc] = auStack_168[0xc];
    auStack_248[0xd] = auStack_168[0xd];
    auStack_248[0xe] = auStack_168[0xe];
    auStack_248[0xf] = auStack_168[0xf];
    abStack_250[0] = abStack_170[0];
    abStack_250[1] = abStack_170[1];
    abStack_250[2] = abStack_170[2];
    abStack_250[3] = abStack_170[3];
    abStack_250[4] = abStack_170[4];
    abStack_250[5] = abStack_170[5];
    abStack_250[6] = abStack_170[6];
    abStack_250[7] = abStack_170[7];
    auStack_248[0] = auStack_168[0];
    auStack_248[1] = auStack_168[1];
    auStack_248[2] = auStack_168[2];
    auStack_248[3] = auStack_168[3];
    auStack_248[4] = auStack_168[4];
    auStack_248[5] = auStack_168[5];
    auStack_248[6] = auStack_168[6];
    auStack_248[7] = auStack_168[7];
    uStack_238._0_7_ = (undefined7)auStack_168._16_8_;
    uStack_238._7_1_ = '@';
    iVar2 = secp256k1_ec_seckey_tweak_mul(CTX,abStack_250,abStack_170);
    if (iVar2 != 0) goto LAB_0013f77d;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_1b0[lVar7] - (uint)abStack_250[lVar7];
      if (auStack_1b0[lVar7] != abStack_250[lVar7]) goto LAB_0013e6b7;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar2 = 0;
LAB_0013e6b7:
    if (iVar2 != 0) goto LAB_0013f782;
    auStack_248[8] = auStack_168[8];
    auStack_248[9] = auStack_168[9];
    auStack_248[10] = auStack_168[10];
    auStack_248[0xb] = auStack_168[0xb];
    auStack_248[0xc] = auStack_168[0xc];
    auStack_248[0xd] = auStack_168[0xd];
    auStack_248[0xe] = auStack_168[0xe];
    auStack_248[0xf] = auStack_168[0xf];
    abStack_250[0] = abStack_170[0];
    abStack_250[1] = abStack_170[1];
    abStack_250[2] = abStack_170[2];
    abStack_250[3] = abStack_170[3];
    abStack_250[4] = abStack_170[4];
    abStack_250[5] = abStack_170[5];
    abStack_250[6] = abStack_170[6];
    abStack_250[7] = abStack_170[7];
    auStack_248[0] = auStack_168[0];
    auStack_248[1] = auStack_168[1];
    auStack_248[2] = auStack_168[2];
    auStack_248[3] = auStack_168[3];
    auStack_248[4] = auStack_168[4];
    auStack_248[5] = auStack_168[5];
    auStack_248[6] = auStack_168[6];
    auStack_248[7] = auStack_168[7];
    uStack_238._0_7_ = (undefined7)auStack_168._16_8_;
    uStack_238._7_1_ = '@';
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_170);
    if (iVar2 != 0) goto LAB_0013f787;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e71e;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e71e:
    if (iVar2 != 0) goto LAB_0013f78c;
    auStack_290[0x20] = auStack_1e0[0x20];
    auStack_290[0x21] = auStack_1e0[0x21];
    auStack_290[0x22] = auStack_1e0[0x22];
    auStack_290[0x23] = auStack_1e0[0x23];
    auStack_290[0x24] = auStack_1e0[0x24];
    auStack_290[0x25] = auStack_1e0[0x25];
    auStack_290[0x26] = auStack_1e0[0x26];
    auStack_290[0x27] = auStack_1e0[0x27];
    auStack_290[0x28] = auStack_1b8[0];
    auStack_290[0x29] = auStack_1b8[1];
    auStack_290[0x2a] = auStack_1b8[2];
    auStack_290[0x2b] = auStack_1b8[3];
    auStack_290[0x2c] = auStack_1b8[4];
    auStack_290[0x2d] = auStack_1b8[5];
    auStack_290[0x2e] = auStack_1b8[6];
    auStack_290[0x2f] = auStack_1b8[7];
    auStack_290[0x10] = auStack_1e0[0x10];
    auStack_290[0x11] = auStack_1e0[0x11];
    auStack_290[0x12] = auStack_1e0[0x12];
    auStack_290[0x13] = auStack_1e0[0x13];
    auStack_290[0x14] = auStack_1e0[0x14];
    auStack_290[0x15] = auStack_1e0[0x15];
    auStack_290[0x16] = auStack_1e0[0x16];
    auStack_290[0x17] = auStack_1e0[0x17];
    auStack_290[0x18] = auStack_1e0[0x18];
    auStack_290[0x19] = auStack_1e0[0x19];
    auStack_290[0x1a] = auStack_1e0[0x1a];
    auStack_290[0x1b] = auStack_1e0[0x1b];
    auStack_290[0x1c] = auStack_1e0[0x1c];
    auStack_290[0x1d] = auStack_1e0[0x1d];
    auStack_290[0x1e] = auStack_1e0[0x1e];
    auStack_290[0x1f] = auStack_1e0[0x1f];
    auStack_290[0] = auStack_1e0[0];
    auStack_290[1] = auStack_1e0[1];
    auStack_290[2] = auStack_1e0[2];
    auStack_290[3] = auStack_1e0[3];
    auStack_290[4] = auStack_1e0[4];
    auStack_290[5] = auStack_1e0[5];
    auStack_290[6] = auStack_1e0[6];
    auStack_290[7] = auStack_1e0[7];
    auStack_290[8] = auStack_1e0[8];
    auStack_290[9] = auStack_1e0[9];
    auStack_290[10] = auStack_1e0[10];
    auStack_290[0xb] = auStack_1e0[0xb];
    auStack_290[0xc] = auStack_1e0[0xc];
    auStack_290[0xd] = auStack_1e0[0xd];
    auStack_290[0xe] = auStack_1e0[0xe];
    auStack_290[0xf] = auStack_1e0[0xf];
    auStack_2a0 = auStack_1f0;
    psStack_298 = psStack_1e8;
    iVar2 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_170);
    if (iVar2 != 0) goto LAB_0013f791;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e79e;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e79e:
    if (iVar2 != 0) goto LAB_0013f796;
    auStack_290[0x20] = auStack_1e0[0x20];
    auStack_290[0x21] = auStack_1e0[0x21];
    auStack_290[0x22] = auStack_1e0[0x22];
    auStack_290[0x23] = auStack_1e0[0x23];
    auStack_290[0x24] = auStack_1e0[0x24];
    auStack_290[0x25] = auStack_1e0[0x25];
    auStack_290[0x26] = auStack_1e0[0x26];
    auStack_290[0x27] = auStack_1e0[0x27];
    auStack_290[0x28] = auStack_1b8[0];
    auStack_290[0x29] = auStack_1b8[1];
    auStack_290[0x2a] = auStack_1b8[2];
    auStack_290[0x2b] = auStack_1b8[3];
    auStack_290[0x2c] = auStack_1b8[4];
    auStack_290[0x2d] = auStack_1b8[5];
    auStack_290[0x2e] = auStack_1b8[6];
    auStack_290[0x2f] = auStack_1b8[7];
    auStack_290[0x10] = auStack_1e0[0x10];
    auStack_290[0x11] = auStack_1e0[0x11];
    auStack_290[0x12] = auStack_1e0[0x12];
    auStack_290[0x13] = auStack_1e0[0x13];
    auStack_290[0x14] = auStack_1e0[0x14];
    auStack_290[0x15] = auStack_1e0[0x15];
    auStack_290[0x16] = auStack_1e0[0x16];
    auStack_290[0x17] = auStack_1e0[0x17];
    auStack_290[0x18] = auStack_1e0[0x18];
    auStack_290[0x19] = auStack_1e0[0x19];
    auStack_290[0x1a] = auStack_1e0[0x1a];
    auStack_290[0x1b] = auStack_1e0[0x1b];
    auStack_290[0x1c] = auStack_1e0[0x1c];
    auStack_290[0x1d] = auStack_1e0[0x1d];
    auStack_290[0x1e] = auStack_1e0[0x1e];
    auStack_290[0x1f] = auStack_1e0[0x1f];
    auStack_290[0] = auStack_1e0[0];
    auStack_290[1] = auStack_1e0[1];
    auStack_290[2] = auStack_1e0[2];
    auStack_290[3] = auStack_1e0[3];
    auStack_290[4] = auStack_1e0[4];
    auStack_290[5] = auStack_1e0[5];
    auStack_290[6] = auStack_1e0[6];
    auStack_290[7] = auStack_1e0[7];
    auStack_290[8] = auStack_1e0[8];
    auStack_290[9] = auStack_1e0[9];
    auStack_290[10] = auStack_1e0[10];
    auStack_290[0xb] = auStack_1e0[0xb];
    auStack_290[0xc] = auStack_1e0[0xc];
    auStack_290[0xd] = auStack_1e0[0xd];
    auStack_290[0xe] = auStack_1e0[0xe];
    auStack_290[0xf] = auStack_1e0[0xf];
    auStack_2a0 = auStack_1f0;
    psStack_298 = psStack_1e8;
    auStack_248[8] = auStack_168[8];
    auStack_248[9] = auStack_168[9];
    auStack_248[10] = auStack_168[10];
    auStack_248[0xb] = auStack_168[0xb];
    auStack_248[0xc] = auStack_168[0xc];
    auStack_248[0xd] = auStack_168[0xd];
    auStack_248[0xe] = auStack_168[0xe];
    auStack_248[0xf] = auStack_168[0xf];
    abStack_250[0] = abStack_170[0];
    abStack_250[1] = abStack_170[1];
    abStack_250[2] = abStack_170[2];
    abStack_250[3] = abStack_170[3];
    abStack_250[4] = abStack_170[4];
    abStack_250[5] = abStack_170[5];
    abStack_250[6] = abStack_170[6];
    abStack_250[7] = abStack_170[7];
    auStack_248[0] = auStack_168[0];
    auStack_248[1] = auStack_168[1];
    auStack_248[2] = auStack_168[2];
    auStack_248[3] = auStack_168[3];
    auStack_248[4] = auStack_168[4];
    auStack_248[5] = auStack_168[5];
    auStack_248[6] = auStack_168[6];
    auStack_248[7] = auStack_168[7];
    uStack_238._0_7_ = (undefined7)auStack_168._16_8_;
    uStack_238._7_1_ = '@';
    abStack_220[0x10] = 0;
    abStack_220[0x11] = 0;
    abStack_220[0x12] = 0;
    abStack_220[0x13] = 0;
    abStack_220[0x14] = 0;
    abStack_220[0x15] = 0;
    abStack_220[0x16] = 0;
    abStack_220[0x17] = 0;
    abStack_220[0] = 0;
    abStack_220[1] = 0;
    abStack_220[2] = 0;
    abStack_220[3] = 0;
    abStack_220[4] = 0;
    abStack_220[5] = 0;
    abStack_220[6] = 0;
    abStack_220[7] = 0;
    abStack_220[8] = 0;
    abStack_220[9] = 0;
    abStack_220[10] = 0;
    abStack_220[0xb] = 0;
    abStack_220[0xc] = 0;
    abStack_220[0xd] = 0;
    abStack_220[0xe] = 0;
    abStack_220[0xf] = 0;
    abStack_220[0x18] = 0;
    abStack_220[0x19] = 0;
    abStack_220[0x1a] = 0;
    abStack_220[0x1b] = 0;
    abStack_220[0x1c] = 0;
    abStack_220[0x1d] = 0;
    abStack_220[0x1e] = 0;
    abStack_220[0x1f] = 1;
    iVar2 = secp256k1_ec_seckey_tweak_add(CTX,abStack_220,abStack_250);
    if (iVar2 != 0) goto LAB_0013f79b;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_1b0[lVar7] - (uint)abStack_220[lVar7];
      if (auStack_1b0[lVar7] != abStack_220[lVar7]) goto LAB_0013e84f;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    iVar2 = 0;
LAB_0013e84f:
    if (iVar2 != 0) goto LAB_0013f7a0;
    abStack_220[0x1f] = 1;
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f7a5;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e8a4;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e8a4:
    if (iVar2 != 0) goto LAB_0013f7aa;
    auStack_290[0x20] = auStack_1e0[0x20];
    auStack_290[0x21] = auStack_1e0[0x21];
    auStack_290[0x22] = auStack_1e0[0x22];
    auStack_290[0x23] = auStack_1e0[0x23];
    auStack_290[0x24] = auStack_1e0[0x24];
    auStack_290[0x25] = auStack_1e0[0x25];
    auStack_290[0x26] = auStack_1e0[0x26];
    auStack_290[0x27] = auStack_1e0[0x27];
    auStack_290[0x28] = auStack_1b8[0];
    auStack_290[0x29] = auStack_1b8[1];
    auStack_290[0x2a] = auStack_1b8[2];
    auStack_290[0x2b] = auStack_1b8[3];
    auStack_290[0x2c] = auStack_1b8[4];
    auStack_290[0x2d] = auStack_1b8[5];
    auStack_290[0x2e] = auStack_1b8[6];
    auStack_290[0x2f] = auStack_1b8[7];
    auStack_290[0x10] = auStack_1e0[0x10];
    auStack_290[0x11] = auStack_1e0[0x11];
    auStack_290[0x12] = auStack_1e0[0x12];
    auStack_290[0x13] = auStack_1e0[0x13];
    auStack_290[0x14] = auStack_1e0[0x14];
    auStack_290[0x15] = auStack_1e0[0x15];
    auStack_290[0x16] = auStack_1e0[0x16];
    auStack_290[0x17] = auStack_1e0[0x17];
    auStack_290[0x18] = auStack_1e0[0x18];
    auStack_290[0x19] = auStack_1e0[0x19];
    auStack_290[0x1a] = auStack_1e0[0x1a];
    auStack_290[0x1b] = auStack_1e0[0x1b];
    auStack_290[0x1c] = auStack_1e0[0x1c];
    auStack_290[0x1d] = auStack_1e0[0x1d];
    auStack_290[0x1e] = auStack_1e0[0x1e];
    auStack_290[0x1f] = auStack_1e0[0x1f];
    auStack_290[0] = auStack_1e0[0];
    auStack_290[1] = auStack_1e0[1];
    auStack_290[2] = auStack_1e0[2];
    auStack_290[3] = auStack_1e0[3];
    auStack_290[4] = auStack_1e0[4];
    auStack_290[5] = auStack_1e0[5];
    auStack_290[6] = auStack_1e0[6];
    auStack_290[7] = auStack_1e0[7];
    auStack_290[8] = auStack_1e0[8];
    auStack_290[9] = auStack_1e0[9];
    auStack_290[10] = auStack_1e0[10];
    auStack_290[0xb] = auStack_1e0[0xb];
    auStack_290[0xc] = auStack_1e0[0xc];
    auStack_290[0xd] = auStack_1e0[0xd];
    auStack_290[0xe] = auStack_1e0[0xe];
    auStack_290[0xf] = auStack_1e0[0xf];
    auStack_2a0 = auStack_1f0;
    psStack_298 = psStack_1e8;
    abStack_220[0x1f] = 2;
    iVar2 = secp256k1_ec_seckey_tweak_add(CTX,abStack_220,abStack_250);
    if (iVar2 == 0) goto LAB_0013f7af;
    lVar7 = 0;
    do {
      iVar2 = (uint)abStack_220[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (abStack_220[lVar7] != auStack_1b0[lVar7]) goto LAB_0013e930;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x1f);
    iVar2 = 0;
LAB_0013e930:
    if ((iVar2 != 0) || (abStack_220[0x1f] != '\x01')) goto LAB_0013f7b4;
    abStack_220[0x1f] = 2;
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_220);
    if (iVar2 == 0) goto LAB_0013f7b9;
    abStack_220[0x1f] = 1;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_1f0,abStack_220);
    if (iVar2 == 0) goto LAB_0013f7be;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1f0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1f0[lVar7]) goto LAB_0013e9bb;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013e9bb:
    if (iVar2 != 0) goto LAB_0013f7c3;
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_220);
    if (iVar2 == 0) goto LAB_0013f7c8;
    abStack_220[0x1f] = 2;
    iVar2 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStack_1f0,abStack_220);
    psVar5 = CTX;
    if (iVar2 == 0) goto LAB_0013f7cd;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1f0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1f0[lVar7]) goto LAB_0013ea34;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013ea34:
    if (iVar2 != 0) goto LAB_0013f7d2;
    iStack_2ac = 0;
    if (secp256k1_context_static == CTX) goto LAB_0013f7d7;
    (CTX->illegal_callback).fn = counting_illegal_callback_fn;
    (psVar5->illegal_callback).data = &iStack_2ac;
  }
  else {
LAB_0013f6dd:
    run_eckey_edge_case_test_cold_3();
LAB_0013f6e2:
    run_eckey_edge_case_test_cold_4();
LAB_0013f6e7:
    run_eckey_edge_case_test_cold_5();
LAB_0013f6ec:
    run_eckey_edge_case_test_cold_6();
LAB_0013f6f1:
    run_eckey_edge_case_test_cold_7();
LAB_0013f6f6:
    run_eckey_edge_case_test_cold_8();
LAB_0013f6fb:
    run_eckey_edge_case_test_cold_9();
LAB_0013f700:
    run_eckey_edge_case_test_cold_111();
LAB_0013f705:
    run_eckey_edge_case_test_cold_110();
LAB_0013f70a:
    run_eckey_edge_case_test_cold_109();
LAB_0013f70f:
    run_eckey_edge_case_test_cold_10();
LAB_0013f714:
    run_eckey_edge_case_test_cold_11();
LAB_0013f719:
    run_eckey_edge_case_test_cold_12();
LAB_0013f71e:
    run_eckey_edge_case_test_cold_108();
LAB_0013f723:
    run_eckey_edge_case_test_cold_107();
LAB_0013f728:
    run_eckey_edge_case_test_cold_106();
LAB_0013f72d:
    run_eckey_edge_case_test_cold_105();
LAB_0013f732:
    run_eckey_edge_case_test_cold_104();
LAB_0013f737:
    run_eckey_edge_case_test_cold_103();
LAB_0013f73c:
    run_eckey_edge_case_test_cold_13();
LAB_0013f741:
    run_eckey_edge_case_test_cold_14();
LAB_0013f746:
    run_eckey_edge_case_test_cold_15();
LAB_0013f74b:
    run_eckey_edge_case_test_cold_16();
LAB_0013f750:
    run_eckey_edge_case_test_cold_17();
LAB_0013f755:
    run_eckey_edge_case_test_cold_102();
LAB_0013f75a:
    run_eckey_edge_case_test_cold_18();
LAB_0013f75f:
    run_eckey_edge_case_test_cold_19();
LAB_0013f764:
    run_eckey_edge_case_test_cold_20();
LAB_0013f769:
    run_eckey_edge_case_test_cold_21();
LAB_0013f76e:
    run_eckey_edge_case_test_cold_22();
LAB_0013f773:
    run_eckey_edge_case_test_cold_23();
LAB_0013f778:
    run_eckey_edge_case_test_cold_24();
LAB_0013f77d:
    run_eckey_edge_case_test_cold_25();
LAB_0013f782:
    run_eckey_edge_case_test_cold_26();
LAB_0013f787:
    run_eckey_edge_case_test_cold_27();
LAB_0013f78c:
    run_eckey_edge_case_test_cold_28();
LAB_0013f791:
    run_eckey_edge_case_test_cold_29();
LAB_0013f796:
    run_eckey_edge_case_test_cold_30();
LAB_0013f79b:
    run_eckey_edge_case_test_cold_31();
LAB_0013f7a0:
    run_eckey_edge_case_test_cold_32();
LAB_0013f7a5:
    run_eckey_edge_case_test_cold_33();
LAB_0013f7aa:
    run_eckey_edge_case_test_cold_34();
LAB_0013f7af:
    run_eckey_edge_case_test_cold_101();
LAB_0013f7b4:
    run_eckey_edge_case_test_cold_100();
LAB_0013f7b9:
    run_eckey_edge_case_test_cold_99();
LAB_0013f7be:
    run_eckey_edge_case_test_cold_98();
LAB_0013f7c3:
    run_eckey_edge_case_test_cold_35();
LAB_0013f7c8:
    run_eckey_edge_case_test_cold_97();
LAB_0013f7cd:
    run_eckey_edge_case_test_cold_96();
LAB_0013f7d2:
    run_eckey_edge_case_test_cold_36();
    psVar5 = extraout_RAX_06;
LAB_0013f7d7:
    (*(psVar5->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  }
  if (iStack_2ac == 0) {
    auStack_290[0] = '\0';
    auStack_290[1] = '\0';
    auStack_290[2] = '\0';
    auStack_290[3] = '\0';
    auStack_290[4] = '\0';
    auStack_290[5] = '\0';
    auStack_290[6] = '\0';
    auStack_290[7] = '\0';
    auStack_290[8] = '\0';
    auStack_290[9] = '\0';
    auStack_290[10] = '\0';
    auStack_290[0xb] = '\0';
    auStack_290[0xc] = '\0';
    auStack_290[0xd] = '\0';
    auStack_290[0xe] = '\0';
    auStack_290[0xf] = '\0';
    auStack_2a0[0] = '\0';
    auStack_2a0[1] = '\0';
    auStack_2a0[2] = '\0';
    auStack_2a0[3] = '\0';
    auStack_2a0[4] = '\0';
    auStack_2a0[5] = '\0';
    auStack_2a0[6] = '\0';
    auStack_2a0[7] = '\0';
    psStack_298 = (secp256k1_pubkey *)0x0;
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStack_2a0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f7f5;
    if (iStack_2ac != 1) goto LAB_0013f7fa;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013eadb;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013eadb:
    if (iVar2 != 0) goto LAB_0013f7ff;
    auStack_290[0x20] = auStack_1e0[0x20];
    auStack_290[0x21] = auStack_1e0[0x21];
    auStack_290[0x22] = auStack_1e0[0x22];
    auStack_290[0x23] = auStack_1e0[0x23];
    auStack_290[0x24] = auStack_1e0[0x24];
    auStack_290[0x25] = auStack_1e0[0x25];
    auStack_290[0x26] = auStack_1e0[0x26];
    auStack_290[0x27] = auStack_1e0[0x27];
    auStack_290[0x28] = auStack_1b8[0];
    auStack_290[0x29] = auStack_1b8[1];
    auStack_290[0x2a] = auStack_1b8[2];
    auStack_290[0x2b] = auStack_1b8[3];
    auStack_290[0x2c] = auStack_1b8[4];
    auStack_290[0x2d] = auStack_1b8[5];
    auStack_290[0x2e] = auStack_1b8[6];
    auStack_290[0x2f] = auStack_1b8[7];
    auStack_290[0x10] = auStack_1e0[0x10];
    auStack_290[0x11] = auStack_1e0[0x11];
    auStack_290[0x12] = auStack_1e0[0x12];
    auStack_290[0x13] = auStack_1e0[0x13];
    auStack_290[0x14] = auStack_1e0[0x14];
    auStack_290[0x15] = auStack_1e0[0x15];
    auStack_290[0x16] = auStack_1e0[0x16];
    auStack_290[0x17] = auStack_1e0[0x17];
    auStack_290[0x18] = auStack_1e0[0x18];
    auStack_290[0x19] = auStack_1e0[0x19];
    auStack_290[0x1a] = auStack_1e0[0x1a];
    auStack_290[0x1b] = auStack_1e0[0x1b];
    auStack_290[0x1c] = auStack_1e0[0x1c];
    auStack_290[0x1d] = auStack_1e0[0x1d];
    auStack_290[0x1e] = auStack_1e0[0x1e];
    auStack_290[0x1f] = auStack_1e0[0x1f];
    auStack_290[0] = auStack_1e0[0];
    auStack_290[1] = auStack_1e0[1];
    auStack_290[2] = auStack_1e0[2];
    auStack_290[3] = auStack_1e0[3];
    auStack_290[4] = auStack_1e0[4];
    auStack_290[5] = auStack_1e0[5];
    auStack_290[6] = auStack_1e0[6];
    auStack_290[7] = auStack_1e0[7];
    auStack_290[8] = auStack_1e0[8];
    auStack_290[9] = auStack_1e0[9];
    auStack_290[10] = auStack_1e0[10];
    auStack_290[0xb] = auStack_1e0[0xb];
    auStack_290[0xc] = auStack_1e0[0xc];
    auStack_290[0xd] = auStack_1e0[0xd];
    auStack_290[0xe] = auStack_1e0[0xe];
    auStack_290[0xf] = auStack_1e0[0xf];
    auStack_2a0 = auStack_1f0;
    psStack_298 = psStack_1e8;
    auStack_1f0[0] = '\0';
    auStack_1f0[1] = '\0';
    auStack_1f0[2] = '\0';
    auStack_1f0[3] = '\0';
    auStack_1f0[4] = '\0';
    auStack_1f0[5] = '\0';
    auStack_1f0[6] = '\0';
    auStack_1f0[7] = '\0';
    psStack_1e8 = (secp256k1_pubkey *)0x0;
    auStack_1e0[0] = '\0';
    auStack_1e0[1] = '\0';
    auStack_1e0[2] = '\0';
    auStack_1e0[3] = '\0';
    auStack_1e0[4] = '\0';
    auStack_1e0[5] = '\0';
    auStack_1e0[6] = '\0';
    auStack_1e0[7] = '\0';
    auStack_1e0[8] = '\0';
    auStack_1e0[9] = '\0';
    auStack_1e0[10] = '\0';
    auStack_1e0[0xb] = '\0';
    auStack_1e0[0xc] = '\0';
    auStack_1e0[0xd] = '\0';
    auStack_1e0[0xe] = '\0';
    auStack_1e0[0xf] = '\0';
    iVar2 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStack_1f0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f804;
    if (iStack_2ac != 2) goto LAB_0013f809;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_1f0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_1f0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013eb6a;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013eb6a:
    if (iVar2 != 0) goto LAB_0013f80e;
    iStack_2ac = 0;
    iVar2 = secp256k1_ec_seckey_verify(CTX,abStack_250);
    if (iVar2 == 0) goto LAB_0013f813;
    if (iStack_2ac != 0) goto LAB_0013f818;
    iVar2 = secp256k1_ec_seckey_verify(CTX,(uchar *)0x0);
    if (iVar2 != 0) goto LAB_0013f81d;
    if (iStack_2ac != 1) goto LAB_0013f822;
    iStack_2ac = 0;
    abStack_220[0x10] = 0;
    abStack_220[0x11] = 0;
    abStack_220[0x12] = 0;
    abStack_220[0x13] = 0;
    abStack_220[0x14] = 0;
    abStack_220[0x15] = 0;
    abStack_220[0x16] = 0;
    abStack_220[0x17] = 0;
    abStack_220[0] = 0;
    abStack_220[1] = 0;
    abStack_220[2] = 0;
    abStack_220[3] = 0;
    abStack_220[4] = 0;
    abStack_220[5] = 0;
    abStack_220[6] = 0;
    abStack_220[7] = 0;
    abStack_220[8] = 0;
    abStack_220[9] = 0;
    abStack_220[10] = 0;
    abStack_220[0xb] = 0;
    abStack_220[0xc] = 0;
    abStack_220[0xd] = 0;
    abStack_220[0xe] = 0;
    abStack_220[0xf] = 0;
    abStack_220[0x18] = 0;
    abStack_220[0x19] = 0;
    abStack_220[0x1a] = 0;
    abStack_220[0x1b] = 0;
    abStack_220[0x1c] = 0;
    abStack_220[0x1d] = 0;
    abStack_220[0x1e] = 0;
    abStack_220[0x1f] = 4;
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)0x0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f827;
    if (iStack_2ac != 1) goto LAB_0013f82c;
    iVar2 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)auStack_2a0,(uchar *)0x0);
    if (iVar2 != 0) goto LAB_0013f831;
    if (iStack_2ac != 2) goto LAB_0013f836;
    iStack_2ac = 0;
    abStack_220[0x10] = 0;
    abStack_220[0x11] = 0;
    abStack_220[0x12] = 0;
    abStack_220[0x13] = 0;
    abStack_220[0x14] = 0;
    abStack_220[0x15] = 0;
    abStack_220[0x16] = 0;
    abStack_220[0x17] = 0;
    abStack_220[0] = 0;
    abStack_220[1] = 0;
    abStack_220[2] = 0;
    abStack_220[3] = 0;
    abStack_220[4] = 0;
    abStack_220[5] = 0;
    abStack_220[6] = 0;
    abStack_220[7] = 0;
    abStack_220[8] = 0;
    abStack_220[9] = 0;
    abStack_220[10] = 0;
    abStack_220[0xb] = 0;
    abStack_220[0xc] = 0;
    abStack_220[0xd] = 0;
    abStack_220[0xe] = 0;
    abStack_220[0xf] = 0;
    abStack_220[0x18] = 0;
    abStack_220[0x19] = 0;
    abStack_220[0x1a] = 0;
    abStack_220[0x1b] = 0;
    abStack_220[0x1c] = 0;
    abStack_220[0x1d] = 0;
    abStack_220[0x1e] = 0;
    abStack_220[0x1f] = 4;
    iVar2 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)0x0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f83b;
    if (iStack_2ac != 1) goto LAB_0013f840;
    iVar2 = secp256k1_ec_pubkey_tweak_mul(CTX,(secp256k1_pubkey *)auStack_2a0,(uchar *)0x0);
    if (iVar2 != 0) goto LAB_0013f845;
    if (iStack_2ac != 2) goto LAB_0013f84a;
    iStack_2ac = 0;
    abStack_220[0] = 0;
    abStack_220[1] = 0;
    abStack_220[2] = 0;
    abStack_220[3] = 0;
    abStack_220[4] = 0;
    abStack_220[5] = 0;
    abStack_220[6] = 0;
    abStack_220[7] = 0;
    abStack_220[8] = 0;
    abStack_220[9] = 0;
    abStack_220[10] = 0;
    abStack_220[0xb] = 0;
    abStack_220[0xc] = 0;
    abStack_220[0xd] = 0;
    abStack_220[0xe] = 0;
    abStack_220[0xf] = 0;
    abStack_220[0x10] = 0;
    abStack_220[0x11] = 0;
    abStack_220[0x12] = 0;
    abStack_220[0x13] = 0;
    abStack_220[0x14] = 0;
    abStack_220[0x15] = 0;
    abStack_220[0x16] = 0;
    abStack_220[0x17] = 0;
    abStack_220[0x18] = 0;
    abStack_220[0x19] = 0;
    abStack_220[0x1a] = 0;
    abStack_220[0x1b] = 0;
    abStack_220[0x1c] = 0;
    abStack_220[0x1d] = 0;
    abStack_220[0x1e] = 0;
    abStack_220[0x1f] = 0;
    iVar2 = secp256k1_ec_seckey_tweak_add(CTX,(uchar *)0x0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f84f;
    if (iStack_2ac != 1) goto LAB_0013f854;
    iVar2 = secp256k1_ec_seckey_tweak_add(CTX,abStack_250,(uchar *)0x0);
    if (iVar2 != 0) goto LAB_0013f859;
    if (iStack_2ac != 2) goto LAB_0013f85e;
    iStack_2ac = 0;
    abStack_220[0x10] = 0;
    abStack_220[0x11] = 0;
    abStack_220[0x12] = 0;
    abStack_220[0x13] = 0;
    abStack_220[0x14] = 0;
    abStack_220[0x15] = 0;
    abStack_220[0x16] = 0;
    abStack_220[0x17] = 0;
    abStack_220[0] = 0;
    abStack_220[1] = 0;
    abStack_220[2] = 0;
    abStack_220[3] = 0;
    abStack_220[4] = 0;
    abStack_220[5] = 0;
    abStack_220[6] = 0;
    abStack_220[7] = 0;
    abStack_220[8] = 0;
    abStack_220[9] = 0;
    abStack_220[10] = 0;
    abStack_220[0xb] = 0;
    abStack_220[0xc] = 0;
    abStack_220[0xd] = 0;
    abStack_220[0xe] = 0;
    abStack_220[0xf] = 0;
    abStack_220[0x18] = 0;
    abStack_220[0x19] = 0;
    abStack_220[0x1a] = 0;
    abStack_220[0x1b] = 0;
    abStack_220[0x1c] = 0;
    abStack_220[0x1d] = 0;
    abStack_220[0x1e] = 0;
    abStack_220[0x1f] = 1;
    iVar2 = secp256k1_ec_seckey_tweak_mul(CTX,(uchar *)0x0,abStack_220);
    if (iVar2 != 0) goto LAB_0013f863;
    if (iStack_2ac != 1) goto LAB_0013f868;
    iVar2 = secp256k1_ec_seckey_tweak_mul(CTX,abStack_250,(uchar *)0x0);
    if (iVar2 != 0) goto LAB_0013f86d;
    if (iStack_2ac != 2) goto LAB_0013f872;
    iStack_2ac = 0;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)0x0,abStack_250);
    if (iVar2 != 0) goto LAB_0013f877;
    if (iStack_2ac != 1) goto LAB_0013f87c;
    builtin_memcpy(auStack_290 + 0x20,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290 + 0x10,
                   "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
    builtin_memcpy(auStack_290,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                   0x10);
    auStack_2a0[0] = '\x01';
    auStack_2a0[1] = '\x01';
    auStack_2a0[2] = '\x01';
    auStack_2a0[3] = '\x01';
    auStack_2a0[4] = '\x01';
    auStack_2a0[5] = '\x01';
    auStack_2a0[6] = '\x01';
    auStack_2a0[7] = '\x01';
    psStack_298 = (secp256k1_pubkey *)0x101010101010101;
    iVar2 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)auStack_2a0,(uchar *)0x0);
    if (iVar2 != 0) goto LAB_0013f881;
    if (iStack_2ac != 2) goto LAB_0013f886;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013ede9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013ede9:
    if (iVar2 != 0) goto LAB_0013f88b;
    iStack_2ac = 0;
    auStack_2a0[0] = 0xff;
    auStack_2a0[1] = 0xff;
    auStack_2a0[2] = 0xff;
    auStack_2a0[3] = 0xff;
    auStack_2a0[4] = 0xff;
    auStack_2a0[5] = 0xff;
    auStack_2a0[6] = 0xff;
    auStack_2a0[7] = 0xff;
    psStack_298 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStack_290[0] = 0xff;
    auStack_290[1] = 0xff;
    auStack_290[2] = 0xff;
    auStack_290[3] = 0xff;
    auStack_290[4] = 0xff;
    auStack_290[5] = 0xff;
    auStack_290[6] = 0xff;
    auStack_290[7] = 0xff;
    auStack_290[8] = 0xff;
    auStack_290[9] = 0xff;
    auStack_290[10] = 0xff;
    auStack_290[0xb] = 0xff;
    auStack_290[0xc] = 0xff;
    auStack_290[0xd] = 0xff;
    auStack_290[0xe] = 0xff;
    auStack_290[0xf] = 0xff;
    auStack_290[0x10] = 0xff;
    auStack_290[0x11] = 0xff;
    auStack_290[0x12] = 0xff;
    auStack_290[0x13] = 0xff;
    auStack_290[0x14] = 0xff;
    auStack_290[0x15] = 0xff;
    auStack_290[0x16] = 0xff;
    auStack_290[0x17] = 0xff;
    auStack_290[0x18] = 0xff;
    auStack_290[0x19] = 0xff;
    auStack_290[0x1a] = 0xff;
    auStack_290[0x1b] = 0xff;
    auStack_290[0x1c] = 0xff;
    auStack_290[0x1d] = 0xff;
    auStack_290[0x1e] = 0xff;
    auStack_290[0x1f] = 0xff;
    auStack_290[0x20] = 0xff;
    auStack_290[0x21] = 0xff;
    auStack_290[0x22] = 0xff;
    auStack_290[0x23] = 0xff;
    auStack_290[0x24] = 0xff;
    auStack_290[0x25] = 0xff;
    auStack_290[0x26] = 0xff;
    auStack_290[0x27] = 0xff;
    auStack_290[0x28] = 0xff;
    auStack_290[0x29] = 0xff;
    auStack_290[0x2a] = 0xff;
    auStack_290[0x2b] = 0xff;
    auStack_290[0x2c] = 0xff;
    auStack_290[0x2d] = 0xff;
    auStack_290[0x2e] = 0xff;
    auStack_290[0x2f] = 0xff;
    uStack_110 = 0x4d430001;
    uStack_100 = 0x40;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    sStack_2a8 = 0;
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    psStack_e0 = (secp256k1_pubkey *)auStack_150;
    iVar2 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStack_2a0,&psStack_e0,0);
    if (iVar2 != 0) goto LAB_0013f890;
    uStack_110 = 0x4d430005;
    uStack_100 = 0x40;
    lVar7 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    sStack_2a8 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013efb1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013efb1:
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    if (iVar2 != 0) goto LAB_0013f895;
    if (iStack_2ac != 1) goto LAB_0013f89a;
    iVar2 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)0x0,&psStack_e0,1);
    if (iVar2 != 0) goto LAB_0013f89f;
    lVar7 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013f00f;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013f00f:
    if (iVar2 != 0) goto LAB_0013f8a4;
    if (iStack_2ac != 2) goto LAB_0013f8a9;
    auStack_290[0x20] = 0xff;
    auStack_290[0x21] = 0xff;
    auStack_290[0x22] = 0xff;
    auStack_290[0x23] = 0xff;
    auStack_290[0x24] = 0xff;
    auStack_290[0x25] = 0xff;
    auStack_290[0x26] = 0xff;
    auStack_290[0x27] = 0xff;
    auStack_290[0x28] = 0xff;
    auStack_290[0x29] = 0xff;
    auStack_290[0x2a] = 0xff;
    auStack_290[0x2b] = 0xff;
    auStack_290[0x2c] = 0xff;
    auStack_290[0x2d] = 0xff;
    auStack_290[0x2e] = 0xff;
    auStack_290[0x2f] = 0xff;
    auStack_290[0x10] = 0xff;
    auStack_290[0x11] = 0xff;
    auStack_290[0x12] = 0xff;
    auStack_290[0x13] = 0xff;
    auStack_290[0x14] = 0xff;
    auStack_290[0x15] = 0xff;
    auStack_290[0x16] = 0xff;
    auStack_290[0x17] = 0xff;
    auStack_290[0x18] = 0xff;
    auStack_290[0x19] = 0xff;
    auStack_290[0x1a] = 0xff;
    auStack_290[0x1b] = 0xff;
    auStack_290[0x1c] = 0xff;
    auStack_290[0x1d] = 0xff;
    auStack_290[0x1e] = 0xff;
    auStack_290[0x1f] = 0xff;
    auStack_290[0] = 0xff;
    auStack_290[1] = 0xff;
    auStack_290[2] = 0xff;
    auStack_290[3] = 0xff;
    auStack_290[4] = 0xff;
    auStack_290[5] = 0xff;
    auStack_290[6] = 0xff;
    auStack_290[7] = 0xff;
    auStack_290[8] = 0xff;
    auStack_290[9] = 0xff;
    auStack_290[10] = 0xff;
    auStack_290[0xb] = 0xff;
    auStack_290[0xc] = 0xff;
    auStack_290[0xd] = 0xff;
    auStack_290[0xe] = 0xff;
    auStack_290[0xf] = 0xff;
    auStack_2a0[0] = 0xff;
    auStack_2a0[1] = 0xff;
    auStack_2a0[2] = 0xff;
    auStack_2a0[3] = 0xff;
    auStack_2a0[4] = 0xff;
    auStack_2a0[5] = 0xff;
    auStack_2a0[6] = 0xff;
    auStack_2a0[7] = 0xff;
    psStack_298 = (secp256k1_pubkey *)0xffffffffffffffff;
    uStack_110 = 0x4d430001;
    uStack_100 = 0x40;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    sStack_2a8 = 0;
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    iVar2 = secp256k1_ec_pubkey_combine
                      (CTX,(secp256k1_pubkey *)auStack_2a0,(secp256k1_pubkey **)0x0,1);
    if (iVar2 != 0) goto LAB_0013f8ae;
    uStack_110 = 0x4d430005;
    uStack_100 = 0x40;
    lVar7 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    sStack_2a8 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013f112;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013f112:
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    if (iVar2 != 0) goto LAB_0013f8b3;
    if (iStack_2ac != 3) goto LAB_0013f8b8;
    psStack_e0 = (secp256k1_pubkey *)auStack_c0;
    auStack_2a0[0] = 0xff;
    auStack_2a0[1] = 0xff;
    auStack_2a0[2] = 0xff;
    auStack_2a0[3] = 0xff;
    auStack_2a0[4] = 0xff;
    auStack_2a0[5] = 0xff;
    auStack_2a0[6] = 0xff;
    auStack_2a0[7] = 0xff;
    psStack_298 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStack_290[0] = 0xff;
    auStack_290[1] = 0xff;
    auStack_290[2] = 0xff;
    auStack_290[3] = 0xff;
    auStack_290[4] = 0xff;
    auStack_290[5] = 0xff;
    auStack_290[6] = 0xff;
    auStack_290[7] = 0xff;
    auStack_290[8] = 0xff;
    auStack_290[9] = 0xff;
    auStack_290[10] = 0xff;
    auStack_290[0xb] = 0xff;
    auStack_290[0xc] = 0xff;
    auStack_290[0xd] = 0xff;
    auStack_290[0xe] = 0xff;
    auStack_290[0xf] = 0xff;
    auStack_290[0x10] = 0xff;
    auStack_290[0x11] = 0xff;
    auStack_290[0x12] = 0xff;
    auStack_290[0x13] = 0xff;
    auStack_290[0x14] = 0xff;
    auStack_290[0x15] = 0xff;
    auStack_290[0x16] = 0xff;
    auStack_290[0x17] = 0xff;
    auStack_290[0x18] = 0xff;
    auStack_290[0x19] = 0xff;
    auStack_290[0x1a] = 0xff;
    auStack_290[0x1b] = 0xff;
    auStack_290[0x1c] = 0xff;
    auStack_290[0x1d] = 0xff;
    auStack_290[0x1e] = 0xff;
    auStack_290[0x1f] = 0xff;
    auStack_290[0x20] = 0xff;
    auStack_290[0x21] = 0xff;
    auStack_290[0x22] = 0xff;
    auStack_290[0x23] = 0xff;
    auStack_290[0x24] = 0xff;
    auStack_290[0x25] = 0xff;
    auStack_290[0x26] = 0xff;
    auStack_290[0x27] = 0xff;
    auStack_290[0x28] = 0xff;
    auStack_290[0x29] = 0xff;
    auStack_290[0x2a] = 0xff;
    auStack_290[0x2b] = 0xff;
    auStack_290[0x2c] = 0xff;
    auStack_290[0x2d] = 0xff;
    auStack_290[0x2e] = 0xff;
    auStack_290[0x2f] = 0xff;
    uStack_110 = 0x4d430001;
    uStack_100 = 0x40;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    sStack_2a8 = 0;
    iVar2 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStack_2a0,&psStack_e0,1);
    if (iVar2 == 0) goto LAB_0013f8bd;
    uStack_110 = 0x4d430005;
    uStack_100 = 0x40;
    lVar7 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    sStack_2a8 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013f229;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013f229:
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    if (iVar2 < 1) goto LAB_0013f8c2;
    if (iStack_2ac != 3) goto LAB_0013f8c7;
    sStack_2a8 = 0x21;
    iVar2 = secp256k1_ec_pubkey_serialize
                      (CTX,abStack_250,&sStack_2a8,(secp256k1_pubkey *)auStack_2a0,0x102);
    if (iVar2 == 0) goto LAB_0013f8cc;
    iVar2 = secp256k1_ec_pubkey_serialize
                      (CTX,abStack_220,&sStack_2a8,(secp256k1_pubkey *)auStack_c0,0x102);
    if (iVar2 == 0) goto LAB_0013f8d1;
    lVar7 = 0;
    do {
      iVar2 = (uint)abStack_250[lVar7] - (uint)abStack_220[lVar7];
      if (abStack_250[lVar7] != abStack_220[lVar7]) goto LAB_0013f2c9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x21);
    iVar2 = 0;
LAB_0013f2c9:
    if (iVar2 != 0) goto LAB_0013f8d6;
    auStack_2a0[0] = 0xff;
    auStack_2a0[1] = 0xff;
    auStack_2a0[2] = 0xff;
    auStack_2a0[3] = 0xff;
    auStack_2a0[4] = 0xff;
    auStack_2a0[5] = 0xff;
    auStack_2a0[6] = 0xff;
    auStack_2a0[7] = 0xff;
    psStack_298 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStack_290[0] = 0xff;
    auStack_290[1] = 0xff;
    auStack_290[2] = 0xff;
    auStack_290[3] = 0xff;
    auStack_290[4] = 0xff;
    auStack_290[5] = 0xff;
    auStack_290[6] = 0xff;
    auStack_290[7] = 0xff;
    auStack_290[8] = 0xff;
    auStack_290[9] = 0xff;
    auStack_290[10] = 0xff;
    auStack_290[0xb] = 0xff;
    auStack_290[0xc] = 0xff;
    auStack_290[0xd] = 0xff;
    auStack_290[0xe] = 0xff;
    auStack_290[0xf] = 0xff;
    auStack_290[0x10] = 0xff;
    auStack_290[0x11] = 0xff;
    auStack_290[0x12] = 0xff;
    auStack_290[0x13] = 0xff;
    auStack_290[0x14] = 0xff;
    auStack_290[0x15] = 0xff;
    auStack_290[0x16] = 0xff;
    auStack_290[0x17] = 0xff;
    auStack_290[0x18] = 0xff;
    auStack_290[0x19] = 0xff;
    auStack_290[0x1a] = 0xff;
    auStack_290[0x1b] = 0xff;
    auStack_290[0x1c] = 0xff;
    auStack_290[0x1d] = 0xff;
    auStack_290[0x1e] = 0xff;
    auStack_290[0x1f] = 0xff;
    auStack_290[0x20] = 0xff;
    auStack_290[0x21] = 0xff;
    auStack_290[0x22] = 0xff;
    auStack_290[0x23] = 0xff;
    auStack_290[0x24] = 0xff;
    auStack_290[0x25] = 0xff;
    auStack_290[0x26] = 0xff;
    auStack_290[0x27] = 0xff;
    auStack_290[0x28] = 0xff;
    auStack_290[0x29] = 0xff;
    auStack_290[0x2a] = 0xff;
    auStack_290[0x2b] = 0xff;
    auStack_290[0x2c] = 0xff;
    auStack_290[0x2d] = 0xff;
    auStack_290[0x2e] = 0xff;
    auStack_290[0x2f] = 0xff;
    uStack_110 = 0x4d430001;
    uStack_100 = 0x40;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_258 = 0;
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    psStack_e0 = (secp256k1_pubkey *)auStack_150;
    psStack_d8 = (secp256k1_pubkey *)auStack_c0;
    iVar2 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStack_2a0,&psStack_e0,2);
    if (iVar2 != 0) goto LAB_0013f8db;
    uStack_110 = 0x4d430005;
    uStack_100 = 0x40;
    lVar7 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_258 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013f3d1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013f3d1:
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    if (iVar2 != 0) goto LAB_0013f8e0;
    if (iStack_2ac != 3) goto LAB_0013f8e5;
    auStack_2a0[0] = 0xff;
    auStack_2a0[1] = 0xff;
    auStack_2a0[2] = 0xff;
    auStack_2a0[3] = 0xff;
    auStack_2a0[4] = 0xff;
    auStack_2a0[5] = 0xff;
    auStack_2a0[6] = 0xff;
    auStack_2a0[7] = 0xff;
    psStack_298 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStack_290[0] = 0xff;
    auStack_290[1] = 0xff;
    auStack_290[2] = 0xff;
    auStack_290[3] = 0xff;
    auStack_290[4] = 0xff;
    auStack_290[5] = 0xff;
    auStack_290[6] = 0xff;
    auStack_290[7] = 0xff;
    auStack_290[8] = 0xff;
    auStack_290[9] = 0xff;
    auStack_290[10] = 0xff;
    auStack_290[0xb] = 0xff;
    auStack_290[0xc] = 0xff;
    auStack_290[0xd] = 0xff;
    auStack_290[0xe] = 0xff;
    auStack_290[0xf] = 0xff;
    auStack_290[0x10] = 0xff;
    auStack_290[0x11] = 0xff;
    auStack_290[0x12] = 0xff;
    auStack_290[0x13] = 0xff;
    auStack_290[0x14] = 0xff;
    auStack_290[0x15] = 0xff;
    auStack_290[0x16] = 0xff;
    auStack_290[0x17] = 0xff;
    auStack_290[0x18] = 0xff;
    auStack_290[0x19] = 0xff;
    auStack_290[0x1a] = 0xff;
    auStack_290[0x1b] = 0xff;
    auStack_290[0x1c] = 0xff;
    auStack_290[0x1d] = 0xff;
    auStack_290[0x1e] = 0xff;
    auStack_290[0x1f] = 0xff;
    auStack_290[0x20] = 0xff;
    auStack_290[0x21] = 0xff;
    auStack_290[0x22] = 0xff;
    auStack_290[0x23] = 0xff;
    auStack_290[0x24] = 0xff;
    auStack_290[0x25] = 0xff;
    auStack_290[0x26] = 0xff;
    auStack_290[0x27] = 0xff;
    auStack_290[0x28] = 0xff;
    auStack_290[0x29] = 0xff;
    auStack_290[0x2a] = 0xff;
    auStack_290[0x2b] = 0xff;
    auStack_290[0x2c] = 0xff;
    auStack_290[0x2d] = 0xff;
    auStack_290[0x2e] = 0xff;
    auStack_290[0x2f] = 0xff;
    uStack_110 = 0x4d430001;
    uStack_100 = 0x40;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_258 = 0;
    psStack_d0 = (secp256k1_pubkey *)auStack_150;
    iVar2 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStack_2a0,&psStack_e0,3);
    if (iVar2 == 0) goto LAB_0013f8ea;
    uStack_110 = 0x4d430005;
    uStack_100 = 0x40;
    lVar7 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_258 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013f4e1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013f4e1:
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    if (iVar2 < 1) goto LAB_0013f8ef;
    if (iStack_2ac != 3) goto LAB_0013f8f4;
    sStack_2a8 = 0x21;
    iVar2 = secp256k1_ec_pubkey_serialize
                      (CTX,abStack_250,&sStack_2a8,(secp256k1_pubkey *)auStack_2a0,0x102);
    if (iVar2 == 0) goto LAB_0013f8f9;
    iVar2 = secp256k1_ec_pubkey_serialize
                      (CTX,abStack_220,&sStack_2a8,(secp256k1_pubkey *)auStack_150,0x102);
    if (iVar2 == 0) goto LAB_0013f8fe;
    lVar7 = 0;
    do {
      iVar2 = (uint)abStack_250[lVar7] - (uint)abStack_220[lVar7];
      if (abStack_250[lVar7] != abStack_220[lVar7]) goto LAB_0013f581;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x21);
    iVar2 = 0;
LAB_0013f581:
    if (iVar2 != 0) goto LAB_0013f903;
    auStack_2a0[0] = 0xff;
    auStack_2a0[1] = 0xff;
    auStack_2a0[2] = 0xff;
    auStack_2a0[3] = 0xff;
    auStack_2a0[4] = 0xff;
    auStack_2a0[5] = 0xff;
    auStack_2a0[6] = 0xff;
    auStack_2a0[7] = 0xff;
    psStack_298 = (secp256k1_pubkey *)0xffffffffffffffff;
    auStack_290[0] = 0xff;
    auStack_290[1] = 0xff;
    auStack_290[2] = 0xff;
    auStack_290[3] = 0xff;
    auStack_290[4] = 0xff;
    auStack_290[5] = 0xff;
    auStack_290[6] = 0xff;
    auStack_290[7] = 0xff;
    auStack_290[8] = 0xff;
    auStack_290[9] = 0xff;
    auStack_290[10] = 0xff;
    auStack_290[0xb] = 0xff;
    auStack_290[0xc] = 0xff;
    auStack_290[0xd] = 0xff;
    auStack_290[0xe] = 0xff;
    auStack_290[0xf] = 0xff;
    auStack_290[0x10] = 0xff;
    auStack_290[0x11] = 0xff;
    auStack_290[0x12] = 0xff;
    auStack_290[0x13] = 0xff;
    auStack_290[0x14] = 0xff;
    auStack_290[0x15] = 0xff;
    auStack_290[0x16] = 0xff;
    auStack_290[0x17] = 0xff;
    auStack_290[0x18] = 0xff;
    auStack_290[0x19] = 0xff;
    auStack_290[0x1a] = 0xff;
    auStack_290[0x1b] = 0xff;
    auStack_290[0x1c] = 0xff;
    auStack_290[0x1d] = 0xff;
    auStack_290[0x1e] = 0xff;
    auStack_290[0x1f] = 0xff;
    auStack_290[0x20] = 0xff;
    auStack_290[0x21] = 0xff;
    auStack_290[0x22] = 0xff;
    auStack_290[0x23] = 0xff;
    auStack_290[0x24] = 0xff;
    auStack_290[0x25] = 0xff;
    auStack_290[0x26] = 0xff;
    auStack_290[0x27] = 0xff;
    auStack_290[0x28] = 0xff;
    auStack_290[0x29] = 0xff;
    auStack_290[0x2a] = 0xff;
    auStack_290[0x2b] = 0xff;
    auStack_290[0x2c] = 0xff;
    auStack_290[0x2d] = 0xff;
    auStack_290[0x2e] = 0xff;
    auStack_290[0x2f] = 0xff;
    uStack_110 = 0x4d430001;
    uStack_100 = 0x40;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_258 = 0;
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    psStack_d8 = (secp256k1_pubkey *)auStack_150;
    iVar2 = secp256k1_ec_pubkey_combine(CTX,(secp256k1_pubkey *)auStack_2a0,&psStack_e0,2);
    psVar5 = CTX;
    if (iVar2 == 0) goto LAB_0013f908;
    uStack_110 = 0x4d430005;
    uStack_100 = 0x40;
    lVar7 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_258 = 0;
    do {
      iVar2 = (uint)(byte)auStack_2a0[lVar7] - (uint)(byte)auStack_1b0[lVar7];
      if (auStack_2a0[lVar7] != auStack_1b0[lVar7]) goto LAB_0013f686;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x40);
    iVar2 = 0;
LAB_0013f686:
    psStack_108 = (secp256k1_pubkey *)auStack_2a0;
    if (iVar2 < 1) goto LAB_0013f90d;
    if (iStack_2ac == 3) {
      if (secp256k1_context_static != CTX) {
        (CTX->illegal_callback).fn = secp256k1_default_illegal_callback_fn;
        (psVar5->illegal_callback).data = (void *)0x0;
        return;
      }
      goto LAB_0013f917;
    }
  }
  else {
    run_eckey_edge_case_test_cold_37();
LAB_0013f7f5:
    run_eckey_edge_case_test_cold_38();
LAB_0013f7fa:
    run_eckey_edge_case_test_cold_39();
LAB_0013f7ff:
    run_eckey_edge_case_test_cold_40();
LAB_0013f804:
    run_eckey_edge_case_test_cold_41();
LAB_0013f809:
    run_eckey_edge_case_test_cold_42();
LAB_0013f80e:
    run_eckey_edge_case_test_cold_43();
LAB_0013f813:
    run_eckey_edge_case_test_cold_95();
LAB_0013f818:
    run_eckey_edge_case_test_cold_44();
LAB_0013f81d:
    run_eckey_edge_case_test_cold_45();
LAB_0013f822:
    run_eckey_edge_case_test_cold_46();
LAB_0013f827:
    run_eckey_edge_case_test_cold_47();
LAB_0013f82c:
    run_eckey_edge_case_test_cold_48();
LAB_0013f831:
    run_eckey_edge_case_test_cold_49();
LAB_0013f836:
    run_eckey_edge_case_test_cold_50();
LAB_0013f83b:
    run_eckey_edge_case_test_cold_51();
LAB_0013f840:
    run_eckey_edge_case_test_cold_52();
LAB_0013f845:
    run_eckey_edge_case_test_cold_53();
LAB_0013f84a:
    run_eckey_edge_case_test_cold_54();
LAB_0013f84f:
    run_eckey_edge_case_test_cold_55();
LAB_0013f854:
    run_eckey_edge_case_test_cold_56();
LAB_0013f859:
    run_eckey_edge_case_test_cold_57();
LAB_0013f85e:
    run_eckey_edge_case_test_cold_58();
LAB_0013f863:
    run_eckey_edge_case_test_cold_59();
LAB_0013f868:
    run_eckey_edge_case_test_cold_60();
LAB_0013f86d:
    run_eckey_edge_case_test_cold_61();
LAB_0013f872:
    run_eckey_edge_case_test_cold_62();
LAB_0013f877:
    run_eckey_edge_case_test_cold_63();
LAB_0013f87c:
    run_eckey_edge_case_test_cold_64();
LAB_0013f881:
    run_eckey_edge_case_test_cold_65();
LAB_0013f886:
    run_eckey_edge_case_test_cold_66();
LAB_0013f88b:
    run_eckey_edge_case_test_cold_67();
LAB_0013f890:
    run_eckey_edge_case_test_cold_68();
LAB_0013f895:
    run_eckey_edge_case_test_cold_69();
LAB_0013f89a:
    run_eckey_edge_case_test_cold_70();
LAB_0013f89f:
    run_eckey_edge_case_test_cold_71();
LAB_0013f8a4:
    run_eckey_edge_case_test_cold_72();
LAB_0013f8a9:
    run_eckey_edge_case_test_cold_73();
LAB_0013f8ae:
    run_eckey_edge_case_test_cold_74();
LAB_0013f8b3:
    run_eckey_edge_case_test_cold_75();
LAB_0013f8b8:
    run_eckey_edge_case_test_cold_76();
LAB_0013f8bd:
    run_eckey_edge_case_test_cold_94();
LAB_0013f8c2:
    run_eckey_edge_case_test_cold_93();
LAB_0013f8c7:
    run_eckey_edge_case_test_cold_77();
LAB_0013f8cc:
    run_eckey_edge_case_test_cold_92();
LAB_0013f8d1:
    run_eckey_edge_case_test_cold_91();
LAB_0013f8d6:
    run_eckey_edge_case_test_cold_78();
LAB_0013f8db:
    run_eckey_edge_case_test_cold_79();
LAB_0013f8e0:
    run_eckey_edge_case_test_cold_80();
LAB_0013f8e5:
    run_eckey_edge_case_test_cold_81();
LAB_0013f8ea:
    run_eckey_edge_case_test_cold_90();
LAB_0013f8ef:
    run_eckey_edge_case_test_cold_89();
LAB_0013f8f4:
    run_eckey_edge_case_test_cold_82();
LAB_0013f8f9:
    run_eckey_edge_case_test_cold_88();
LAB_0013f8fe:
    run_eckey_edge_case_test_cold_87();
LAB_0013f903:
    run_eckey_edge_case_test_cold_83();
LAB_0013f908:
    run_eckey_edge_case_test_cold_86();
LAB_0013f90d:
    run_eckey_edge_case_test_cold_85();
  }
  run_eckey_edge_case_test_cold_84();
  psVar5 = extraout_RAX_07;
LAB_0013f917:
  (*(psVar5->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar5->illegal_callback).data);
  return;
}

Assistant:

static void run_static_context_tests(int use_prealloc) {
    /* Check that deprecated secp256k1_context_no_precomp is an alias to secp256k1_context_static. */
    CHECK(secp256k1_context_no_precomp == secp256k1_context_static);

    {
        unsigned char seed[32] = {0x17};

        /* Randomizing secp256k1_context_static is not supported. */
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, seed));
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, NULL));

        /* Destroying or cloning secp256k1_context_static is not supported. */
        if (use_prealloc) {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone_size(STATIC_CTX));
            {
                secp256k1_context *my_static_ctx = malloc(sizeof(*STATIC_CTX));
                CHECK(my_static_ctx != NULL);
                memset(my_static_ctx, 0x2a, sizeof(*my_static_ctx));
                CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone(STATIC_CTX, my_static_ctx));
                CHECK(all_bytes_equal(my_static_ctx, 0x2a, sizeof(*my_static_ctx)));
                free(my_static_ctx);
            }
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_preallocated_destroy(STATIC_CTX));
        } else {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_clone(STATIC_CTX));
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_destroy(STATIC_CTX));
        }
    }

    {
        /* Verify that setting and resetting illegal callback works */
        int32_t dummy = 0;
        secp256k1_context_set_illegal_callback(STATIC_CTX, counting_illegal_callback_fn, &dummy);
        CHECK(STATIC_CTX->illegal_callback.fn == counting_illegal_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == &dummy);
        secp256k1_context_set_illegal_callback(STATIC_CTX, NULL, NULL);
        CHECK(STATIC_CTX->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == NULL);
    }
}